

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O3

void __thiscall Spaghetti<UFPC>::PerformLabeling(Spaghetti<UFPC> *this)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  uint uVar48;
  ulong uVar49;
  int local_180;
  ulong local_140;
  long local_118;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar2 = *(uint *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  uVar11 = (ulong)(int)uVar3;
  cv::Mat::Mat(local_90,**(int **)&pMVar4->field_0x40,(*(int **)&pMVar4->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  uVar48 = uVar2 & 0xfffffffe;
  cv::Mat::~Mat(local_90);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar7 = (uint *)operator_new__((ulong)(((*(int *)&pMVar4->field_0xc -
                                           (*(int *)&pMVar4->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                          ((*(int *)&pMVar4->field_0x8 -
                                           (*(int *)&pMVar4->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                  << 2);
  UFPC::P_ = puVar7;
  *puVar7 = 0;
  UFPC::length_ = 1;
  lVar45 = *(long *)&pMVar4->field_0x10;
  if (uVar2 == 1) {
    lVar46 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar23 = uVar3 - 2;
    uVar40 = 0;
    if (2 < (int)uVar3) {
      uVar38 = 0xfffffffe;
      uVar25 = 0;
LAB_0013e9b7:
      uVar40 = (uint)uVar25;
      if (*(char *)(lVar45 + (int)uVar40) == '\0') goto LAB_0013e9e7;
      cVar1 = *(char *)(lVar45 + 3 + (long)(int)uVar38);
      puVar7[UFPC::length_] = UFPC::length_;
      uVar38 = UFPC::length_ + 1;
      *(uint *)(lVar46 + (long)(int)uVar40 * 4) = UFPC::length_;
      UFPC::length_ = uVar38;
      uVar38 = uVar40;
      if (cVar1 == '\0') goto LAB_0013ea66;
      while( true ) {
        uVar38 = (int)uVar25 + 2;
        if ((int)uVar23 <= (int)uVar38) break;
        uVar26 = (long)(int)uVar25;
        while (*(char *)(lVar45 + 2 + uVar26) != '\0') {
          if (*(char *)(lVar45 + 3 + uVar26) == '\0') {
            uVar10 = *(undefined4 *)(lVar46 + uVar26 * 4);
            lVar33 = uVar26 + 2;
            goto LAB_0013ea62;
          }
          *(undefined4 *)(lVar46 + 8 + uVar26 * 4) = *(undefined4 *)(lVar46 + uVar26 * 4);
          uVar25 = uVar26 + 2;
          uVar38 = uVar38 + 2;
          lVar33 = uVar26 + 4;
          uVar26 = uVar25;
          if ((long)(ulong)uVar23 <= lVar33) goto LAB_0013ecea;
        }
        uVar25 = (ulong)uVar38;
LAB_0013e9e7:
        uVar38 = (uint)uVar25;
        lVar33 = (long)(int)uVar38;
        if (*(char *)(lVar45 + 1 + lVar33) == '\0') goto LAB_0013ea4d;
        puVar7[UFPC::length_] = UFPC::length_;
        uVar40 = UFPC::length_ + 1;
        *(uint *)(lVar46 + lVar33 * 4) = UFPC::length_;
        UFPC::length_ = uVar40;
      }
LAB_0013ecea:
      lVar33 = (long)(int)uVar38;
      if ((int)uVar23 < (int)uVar38) {
        if (*(char *)(lVar45 + lVar33) == '\0') goto LAB_0013eddb;
      }
      else if (*(char *)(lVar45 + lVar33) == '\0') goto LAB_0013edbe;
      *(undefined4 *)(lVar46 + lVar33 * 4) = *(undefined4 *)(lVar46 + (long)(int)uVar25 * 4);
      goto LAB_0014307a;
    }
LAB_0013ea75:
    lVar33 = (long)(int)uVar40;
    cVar1 = *(char *)(lVar45 + lVar33);
    if ((int)uVar23 < (int)uVar40) {
joined_r0x0013edc4:
      if (cVar1 == '\0') {
LAB_0013eddb:
        *(undefined4 *)(lVar46 + lVar33 * 4) = 0;
        goto LAB_0014307a;
      }
    }
    else if (cVar1 == '\0') {
LAB_0013edbe:
      cVar1 = *(char *)(lVar45 + 1 + lVar33);
      goto joined_r0x0013edc4;
    }
    puVar7[UFPC::length_] = UFPC::length_;
    uVar40 = UFPC::length_ + 1;
    *(uint *)(lVar46 + lVar33 * 4) = UFPC::length_;
    UFPC::length_ = uVar40;
  }
  else {
    lVar33 = **(long **)&pMVar4->field_0x48;
    lVar46 = lVar45 + lVar33;
    lVar32 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar25 = uVar11 - 2;
    uVar26 = 0;
    local_180 = (int)uVar25;
    if (2 < (int)uVar3) {
      uVar26 = 0;
      do {
        lVar17 = (long)(int)uVar26;
        if (*(char *)(lVar45 + lVar17) != '\0') goto LAB_0013ec69;
        if (*(char *)(lVar46 + lVar17) != '\0') goto LAB_0013ec69;
LAB_0013eb0f:
        iVar27 = (int)uVar26;
        uVar21 = (ulong)iVar27;
        if ((*(char *)(uVar21 + 1 + lVar45) != '\0') || (*(char *)(lVar46 + 1 + uVar21) != '\0')) {
          uVar19 = (ulong)UFPC::length_;
          puVar7[uVar19] = UFPC::length_;
          UFPC::length_ = UFPC::length_ + 1;
LAB_0013eb35:
          *(int *)(lVar32 + uVar21 * 4) = (int)uVar19;
LAB_0013eb58:
          lVar17 = (long)(int)uVar26;
          uVar26 = lVar17 + 2;
          if ((int)uVar26 < local_180) {
            if ((*(char *)(lVar45 + uVar26) != '\0') || (*(char *)(lVar46 + uVar26) != '\0')) {
LAB_0013eb75:
              lVar17 = (long)(int)uVar26;
              cVar1 = *(char *)(lVar45 + 1 + lVar17);
              *(undefined4 *)(lVar32 + lVar17 * 4) = *(undefined4 *)(lVar32 + -8 + lVar17 * 4);
              if (cVar1 == '\0') {
                do {
                  iVar27 = (int)uVar26;
                  uVar40 = iVar27 + 2;
                  if (local_180 <= (int)uVar40) {
LAB_0013ed17:
                    uVar26 = (ulong)(int)uVar40;
                    if (local_180 < (int)uVar40) {
                      if ((*(char *)(lVar45 + uVar26) == '\0') &&
                         (*(char *)(lVar46 + uVar26) == '\0')) {
                        *(undefined4 *)(lVar32 + uVar26 * 4) = 0;
                        goto LAB_0013ee90;
                      }
                    }
                    else {
                      if (*(char *)(lVar45 + uVar26) != '\0') {
                        uVar21 = uVar26;
                        if (*(char *)(lVar46 + 1 + (long)iVar27) != '\0') goto LAB_0013ee89;
                        goto LAB_0013eda9;
                      }
                      if (*(char *)(lVar46 + uVar26) == '\0') {
                        uVar26 = (ulong)uVar40;
                        goto LAB_0013ee58;
                      }
                    }
                    if (*(char *)(lVar46 + 1 + (long)iVar27) == '\0') {
                      puVar7[UFPC::length_] = UFPC::length_;
                      uVar23 = UFPC::length_ + 1;
                      *(uint *)(lVar32 + (long)(int)uVar40 * 4) = UFPC::length_;
                      UFPC::length_ = uVar23;
                    }
                    else {
                      *(undefined4 *)(lVar32 + (long)(int)uVar40 * 4) =
                           *(undefined4 *)(lVar32 + (long)iVar27 * 4);
                    }
                    goto LAB_0013ee90;
                  }
                  lVar18 = (long)iVar27;
                  lVar12 = lVar18 + 2;
                  lVar17 = lVar32 + lVar18 * 4;
                  lVar47 = lVar45 + lVar33 + 2 + lVar18;
                  lVar22 = lVar45 + 2 + lVar18;
                  lVar18 = lVar18 << 0x20;
                  lVar36 = 0;
                  while (*(char *)(lVar22 + lVar36) == '\0') {
                    if (*(char *)(lVar47 + lVar36) == '\0') {
                      uVar26 = (ulong)(uint)((int)lVar12 + (int)lVar36);
                      goto LAB_0013eb0f;
                    }
                    if (*(char *)(lVar22 + 1 + lVar36) != '\0') {
                      uVar21 = lVar12 + lVar36;
                      if (*(char *)(lVar36 + -1 + lVar47) == '\0') {
                        uVar19 = (ulong)UFPC::length_;
                        puVar7[uVar19] = UFPC::length_;
                        UFPC::length_ = UFPC::length_ + 1;
                      }
                      else {
                        uVar19 = (ulong)*(uint *)(lVar17 + lVar36 * 4);
                      }
                      uVar26 = uVar21 & 0xffffffff;
                      goto LAB_0013eb35;
                    }
                    if (*(char *)(lVar47 + -1 + lVar36) == '\0') {
                      puVar7[UFPC::length_] = UFPC::length_;
                      uVar40 = UFPC::length_;
                      UFPC::length_ = UFPC::length_ + 1;
                    }
                    else {
                      uVar40 = *(uint *)(lVar17 + lVar36 * 4);
                    }
                    *(uint *)(lVar17 + 8 + lVar36 * 4) = uVar40;
                    lVar18 = lVar18 + 0x200000000;
                    lVar31 = lVar12 + lVar36;
                    lVar36 = lVar36 + 2;
                    if ((long)(uVar25 & 0xffffffff) <= lVar31 + 2) {
                      uVar40 = iVar27 + (int)lVar36 + 2;
                      iVar27 = iVar27 + (int)lVar36;
                      goto LAB_0013ed17;
                    }
                  }
                  if (*(char *)(lVar46 + 1 + (lVar18 >> 0x20)) != '\0') goto code_r0x0013ec2c;
                  lVar17 = lVar18 + 0x200000000 >> 0x20;
                  uVar26 = lVar12 + lVar36 & 0xffffffff;
LAB_0013ec69:
                  cVar1 = *(char *)(lVar45 + 1 + lVar17);
                  puVar7[UFPC::length_] = UFPC::length_;
                  uVar40 = UFPC::length_ + 1;
                  *(uint *)(lVar32 + lVar17 * 4) = UFPC::length_;
                  UFPC::length_ = uVar40;
                  if (cVar1 != '\0') break;
                } while( true );
              }
              goto LAB_0013eb58;
            }
            goto LAB_0013eb0f;
          }
          if (local_180 < (int)uVar26) {
            if ((*(char *)(lVar45 + uVar26) == '\0') && (*(char *)(lVar46 + uVar26) == '\0')) {
              *(undefined4 *)(lVar32 + 8 + lVar17 * 4) = 0;
            }
            else {
              *(undefined4 *)(lVar32 + 8 + lVar17 * 4) = *(undefined4 *)(lVar32 + lVar17 * 4);
            }
          }
          else {
            if ((*(char *)(lVar45 + uVar26) == '\0') && (*(char *)(lVar46 + uVar26) == '\0'))
            goto LAB_0013ee58;
LAB_0013ee89:
            *(undefined4 *)(lVar32 + uVar26 * 4) = *(undefined4 *)(lVar32 + -8 + uVar26 * 4);
          }
          goto LAB_0013ee90;
        }
        *(undefined4 *)(lVar32 + (long)iVar27 * 4) = 0;
        uVar26 = (ulong)(iVar27 + 2U);
      } while ((int)(iVar27 + 2U) < local_180);
    }
    uVar21 = (ulong)(int)uVar26;
    if (local_180 < (int)uVar26) {
      if ((*(char *)(lVar45 + uVar21) == '\0') && (*(char *)(lVar46 + uVar21) == '\0')) {
        *(undefined4 *)(lVar32 + uVar21 * 4) = 0;
      }
      else {
LAB_0013eda9:
        puVar7[UFPC::length_] = UFPC::length_;
        uVar40 = UFPC::length_ + 1;
        *(uint *)(lVar32 + uVar21 * 4) = UFPC::length_;
        UFPC::length_ = uVar40;
      }
    }
    else {
      if ((*(char *)(lVar45 + uVar21) != '\0') || (*(char *)(lVar46 + uVar21) != '\0'))
      goto LAB_0013eda9;
LAB_0013ee58:
      lVar33 = (long)(int)uVar26;
      if ((*(char *)(lVar33 + 1 + lVar45) == '\0') && (*(char *)(lVar46 + 1 + lVar33) == '\0')) {
        *(undefined4 *)(lVar32 + lVar33 * 4) = 0;
      }
      else {
        puVar7[UFPC::length_] = UFPC::length_;
        uVar40 = UFPC::length_ + 1;
        *(uint *)(lVar32 + lVar33 * 4) = UFPC::length_;
        UFPC::length_ = uVar40;
      }
    }
LAB_0013ee90:
    if (2 < (int)uVar48) {
      uVar26 = 2;
      lVar46 = 1;
      lVar45 = 3;
      local_118 = 0;
      do {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar17 = *(long *)&pMVar4->field_0x10;
        lVar12 = **(long **)&pMVar4->field_0x48;
        lVar41 = lVar12 * uVar26;
        lVar33 = lVar17 + lVar41;
        lVar16 = lVar33 - lVar12;
        lVar32 = lVar33 + lVar12;
        lVar47 = *(long *)&pMVar5->field_0x10;
        lVar22 = **(long **)&pMVar5->field_0x48;
        lVar18 = lVar22 * uVar26;
        lVar36 = lVar47 + lVar18;
        lVar31 = lVar36 + lVar22 * -2;
        cVar1 = *(char *)(lVar17 + lVar41);
        if (2 < (int)uVar3) {
          lVar29 = lVar16 - lVar12;
          uVar21 = 0;
          local_140 = 0;
          if (cVar1 == '\0') goto LAB_0013f034;
LAB_0013ef86:
          lVar34 = (long)(int)uVar21;
          if (*(char *)(lVar34 + 1 + lVar16) == '\0') {
            local_140 = uVar21;
            if (*(char *)(lVar33 + 1 + lVar34) != '\0') goto LAB_0013f09e;
            if (*(char *)(lVar16 + lVar34) == '\0') {
              UFPC::P_[UFPC::length_] = UFPC::length_;
              uVar40 = UFPC::length_ + 1;
              *(uint *)(lVar36 + lVar34 * 4) = UFPC::length_;
              UFPC::length_ = uVar40;
              goto LAB_0013fac1;
            }
            *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
            goto LAB_001403f6;
          }
          *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
          uVar19 = uVar21;
LAB_001417c6:
          do {
            iVar27 = (int)uVar19;
            uVar40 = iVar27 + 2;
            if (local_180 <= (int)uVar40) {
LAB_00141906:
              local_140 = (ulong)uVar40;
              if (local_180 < (int)uVar40) {
                if (*(char *)(lVar33 + local_140) == '\0') {
                  if (*(char *)(lVar32 + local_140) == '\0') goto LAB_001419d4;
LAB_00141a49:
                  if ((*(char *)(lVar32 + (ulong)(iVar27 + 1)) == '\0') &&
                     (*(char *)(lVar33 + (ulong)(iVar27 + 1)) == '\0')) goto LAB_0013f91a;
                }
                else if ((*(char *)(lVar33 + (ulong)(iVar27 + 1)) == '\0') &&
                        (*(char *)(lVar32 + (ulong)(iVar27 + 1)) == '\0')) {
LAB_00141c68:
                  if (*(char *)(lVar16 + local_140) != '\0') goto LAB_0013efd8;
                  uVar10 = *(undefined4 *)(lVar31 + (long)iVar27 * 4);
                  goto LAB_00141a64;
                }
LAB_00141a5e:
                lVar17 = (long)iVar27;
LAB_00141a61:
                uVar10 = *(undefined4 *)(lVar36 + lVar17 * 4);
                goto LAB_00141a64;
              }
              if (*(char *)(lVar33 + local_140) == '\0') {
                if (*(char *)(lVar32 + local_140) == '\0') {
LAB_00141c4e:
                  uVar21 = local_140 & 0xffffffff;
                  goto LAB_0013f8f4;
                }
                if (*(char *)(lVar33 + (ulong)(iVar27 + 3)) == '\0') goto LAB_00141a49;
                if (*(char *)(lVar33 + (ulong)(iVar27 + 1)) != '\0') goto LAB_00141a0f;
                if (*(char *)(lVar32 + (ulong)(iVar27 + 1)) == '\0') goto LAB_0013ef52;
                if (*(char *)(lVar16 + (ulong)(iVar27 + 3)) == '\0') {
                  if (*(char *)(lVar16 + local_140) == '\0') goto LAB_00141a5e;
                  goto LAB_0013efd8;
                }
                uVar19 = (ulong)(int)uVar40;
LAB_00141a1a:
                if (*(char *)(lVar16 + uVar19) != '\0') {
LAB_00141a21:
                  uVar10 = *(undefined4 *)(lVar31 + uVar19 * 4);
LAB_00141a2a:
                  *(undefined4 *)(lVar36 + uVar19 * 4) = uVar10;
                  goto LAB_00141a6c;
                }
                uVar40 = *(uint *)(lVar31 + uVar19 * 4);
                if (*(char *)(lVar29 + uVar19) != '\0') {
                  *(uint *)(lVar36 + uVar19 * 4) = uVar40;
                  goto LAB_00141a6c;
                }
                uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
              }
              else {
                if ((*(char *)(lVar33 + (ulong)(iVar27 + 1)) != '\0') ||
                   (*(char *)(lVar32 + (ulong)(iVar27 + 1)) != '\0')) {
LAB_00141a0f:
                  uVar19 = (ulong)(int)uVar40;
                  if (*(char *)(lVar16 + 1 + uVar19) != '\0') goto LAB_00141a1a;
                  uVar10 = *(undefined4 *)(lVar36 + -8 + uVar19 * 4);
                  goto LAB_00141a2a;
                }
                if (*(char *)(lVar16 + 3 + (long)iVar27) == '\0') goto LAB_00141c68;
                if (*(char *)(lVar16 + local_140) != '\0') goto LAB_0013efd8;
                uVar19 = (ulong)(int)uVar40;
LAB_0014197b:
                if (*(char *)(lVar29 + uVar19) != '\0') goto LAB_00141a21;
                uVar40 = *(uint *)(lVar31 + -8 + uVar19 * 4);
                uVar23 = *(uint *)(lVar31 + uVar19 * 4);
              }
LAB_00140052:
              uVar40 = UFPC::Merge(uVar40,uVar23);
              *(uint *)(lVar36 + uVar19 * 4) = uVar40;
              goto LAB_00141a6c;
            }
            lVar13 = (long)iVar27;
            lVar34 = lVar13 + 2;
            lVar37 = lVar12 * lVar45 + lVar13;
            lVar28 = lVar12 * lVar46 + lVar13;
            lVar35 = lVar22 * local_118 + lVar13 * 4;
            lVar9 = lVar18 + lVar13 * 4;
            lVar20 = lVar13 << 0x20;
            lVar15 = lVar17 + lVar41 + lVar13;
            lVar8 = lVar17 + 2 + lVar28;
            lVar39 = lVar47 + lVar35 + 8;
            lVar44 = lVar47 + lVar9 + 8;
            lVar30 = 0;
            while( true ) {
              lVar43 = lVar20 >> 0x1e;
              lVar24 = lVar20 >> 0x20;
              if (*(char *)(lVar15 + 2 + lVar30) == '\0') goto LAB_00141a8f;
              iVar14 = (int)lVar34;
              if ((*(char *)(lVar15 + 1 + lVar30) != '\0') ||
                 (*(char *)(lVar17 + lVar37 + 1 + lVar30) != '\0')) {
                local_140 = (ulong)(uint)(iVar14 + (int)lVar30);
                goto LAB_00140e7b;
              }
              if (*(char *)(lVar8 + 1 + lVar30) == '\0') {
                local_140 = lVar34 + lVar30;
                if (*(char *)(lVar30 + 3 + lVar41 + lVar13 + lVar17) == '\0') {
                  if (*(char *)(lVar30 + 2 + lVar28 + lVar17) == '\0') {
                    *(undefined4 *)(lVar9 + lVar47 + 8 + lVar30 * 4) =
                         *(undefined4 *)(lVar31 + lVar43);
                    goto LAB_0013fac1;
                  }
                  *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar39 + lVar30 * 4);
                  goto LAB_001403f6;
                }
                cVar1 = *(char *)(lVar30 + 2 + lVar28 + lVar17);
                if (*(char *)(lVar16 + 4 + lVar24) != '\0') {
                  if (cVar1 != '\0') goto LAB_0013f0c0;
                  uVar21 = lVar20 + 0x200000000 >> 0x20;
                  goto LAB_00141e33;
                }
                if (cVar1 != '\0') goto LAB_00141d48;
                *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar31 + lVar24 * 4);
                goto LAB_00141f01;
              }
              if (*(char *)(lVar8 + lVar30) == '\0') break;
              *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar39 + lVar30 * 4);
              lVar20 = lVar20 + 0x200000000;
              lVar43 = lVar34 + lVar30;
              lVar30 = lVar30 + 2;
              if ((long)uVar25 <= lVar43 + 2) {
                iVar27 = iVar27 + (int)lVar30;
                uVar40 = iVar14 + (int)lVar30;
                goto LAB_00141906;
              }
            }
            uVar19 = (ulong)(uint)(iVar14 + (int)lVar30);
            lVar34 = lVar20 + 0x200000000 >> 0x20;
LAB_00141bf0:
            if (*(char *)(lVar29 + lVar34) == '\0') {
              uVar40 = UFPC::Merge(*(uint *)(lVar31 + -8 + lVar34 * 4),
                                   *(uint *)(lVar31 + lVar34 * 4));
            }
            else {
              uVar40 = *(uint *)(lVar31 + lVar34 * 4);
            }
            *(uint *)(lVar36 + lVar34 * 4) = uVar40;
          } while( true );
        }
        if (uVar3 == 2) {
          uVar21 = 0;
          uVar40 = 0;
          if (cVar1 == '\0') {
LAB_0013f8d6:
            uVar40 = (uint)uVar21;
            local_140 = (ulong)(int)uVar40;
            if (*(char *)(lVar32 + local_140) == '\0') {
              uVar21 = uVar21 & 0xffffffff;
LAB_0013f8f4:
              uVar40 = (uint)uVar21;
              if (*(char *)(lVar33 + 1 + (long)(int)uVar40) != '\0') goto LAB_0013ef52;
LAB_0013f90c:
              local_140 = (ulong)(int)uVar40;
              if (*(char *)(lVar32 + 1 + local_140) == '\0') goto LAB_001419d4;
            }
            else if (*(char *)(lVar33 + 1 + local_140) != '\0') goto LAB_0013ef52;
LAB_0013f91a:
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar40 = UFPC::length_ + 1;
            *(uint *)(lVar36 + local_140 * 4) = UFPC::length_;
            UFPC::length_ = uVar40;
          }
          else {
LAB_0013ef52:
            local_140 = (ulong)(int)uVar40;
            if (*(char *)(lVar16 + 1 + local_140) == '\0') goto LAB_0013efca;
LAB_0013efd8:
            uVar10 = *(undefined4 *)(lVar31 + local_140 * 4);
LAB_00141a64:
            *(undefined4 *)(lVar36 + local_140 * 4) = uVar10;
          }
        }
        else {
          uVar40 = 0;
          uVar21 = 0;
          if (cVar1 != '\0') {
LAB_0013efca:
            local_140 = (ulong)(int)uVar40;
            cVar1 = *(char *)(lVar16 + local_140);
joined_r0x00140b59:
            if (cVar1 == '\0') goto LAB_0013f91a;
            goto LAB_0013efd8;
          }
LAB_0013f882:
          local_140 = (ulong)(int)uVar21;
          if (*(char *)(lVar32 + local_140) != '\0') goto LAB_0013f91a;
LAB_001419d4:
          *(undefined4 *)(lVar36 + local_140 * 4) = 0;
        }
LAB_00141a6c:
        uVar26 = uVar26 + 2;
        lVar46 = lVar46 + 2;
        local_118 = local_118 + 2;
        lVar45 = lVar45 + 2;
      } while (uVar26 < uVar48);
    }
    if ((uVar2 & 0x80000001) == 1) {
      uVar26 = (ulong)(uVar2 - 1);
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar32 = *(long *)&pMVar4->field_0x10;
      lVar17 = **(long **)&pMVar4->field_0x48;
      lVar45 = lVar32 + lVar17 * uVar26;
      lVar47 = lVar45 - lVar17;
      lVar33 = *(long *)&pMVar5->field_0x10;
      lVar12 = **(long **)&pMVar5->field_0x48;
      lVar46 = lVar33 + lVar12 * uVar26;
      lVar22 = lVar46 + lVar12 * -2;
      uVar40 = 0;
      if (2 < (int)uVar3) {
        lVar31 = lVar47 - lVar17;
        lVar18 = lVar47 + 1;
        lVar16 = lVar31 + -1;
        lVar36 = lVar22 + 8;
        uVar25 = uVar25 & 0xffffffff;
        lVar34 = lVar12 * uVar26 + lVar33 + 8;
        lVar35 = (uVar26 - 1) * lVar17;
        lVar41 = lVar35 + lVar32 + 4;
        lVar29 = lVar17 * uVar26 + lVar32 + 3;
        lVar17 = lVar17 * (uVar26 - 2) + lVar32 + 3;
        lVar33 = lVar12 * (uVar26 - 2) + lVar33;
        lVar12 = lVar33 + 0x10;
        iVar27 = -2;
        uVar26 = 0;
        do {
          lVar9 = (long)(int)uVar26;
          if (*(char *)(lVar45 + lVar9) == '\0') goto LAB_00142188;
          if (*(char *)((long)iVar27 + 3 + lVar47) != '\0') {
            *(undefined4 *)(lVar46 + lVar9 * 4) = *(undefined4 *)(lVar22 + lVar9 * 4);
            goto LAB_00142a2e;
          }
          if (*(char *)(lVar45 + 3 + (long)iVar27) != '\0') {
LAB_001421a2:
            uVar21 = (ulong)(int)uVar26;
            if (*(char *)(lVar47 + 2 + uVar21) != '\0') {
              if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_001421b8;
              goto LAB_0014255d;
            }
            if (*(char *)(lVar47 + uVar21) == '\0') goto LAB_00142568;
LAB_001421ea:
            *(undefined4 *)(lVar46 + uVar21 * 4) = *(undefined4 *)(lVar22 + uVar21 * 4);
            lVar9 = (long)(int)uVar26;
            uVar21 = lVar9 + 2;
            uVar26 = uVar21;
            if ((int)uVar21 < local_180) {
              if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_00142515;
              if (*(char *)(lVar9 + 3 + lVar47) != '\0') {
                lVar15 = lVar16;
                if (*(char *)(lVar31 + uVar21) != '\0') goto LAB_00142bbe;
                uVar40 = UFPC::Merge(*(uint *)(lVar22 + 8 + lVar9 * 4),*(uint *)(lVar46 + lVar9 * 4)
                                    );
                *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
                goto LAB_00142a2e;
              }
              if (*(char *)(lVar45 + 3 + lVar9) != '\0') {
                if (*(char *)(lVar9 + 4 + lVar47) == '\0') {
                  *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = *(undefined4 *)(lVar46 + lVar9 * 4);
                  goto LAB_0014278b;
                }
                if ((*(char *)(lVar31 + 3 + lVar9) != '\0') && (*(char *)(lVar31 + uVar21) != '\0'))
                goto LAB_00142923;
                uVar40 = UFPC::Merge(*(uint *)(lVar22 + 0x10 + lVar9 * 4),
                                     *(uint *)(lVar46 + lVar9 * 4));
                *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
LAB_0014258d:
                do {
                  iVar27 = (int)uVar26;
                  uVar40 = iVar27 + 2;
                  if (local_180 <= (int)uVar40) {
LAB_00142dec:
                    if (local_180 < (int)uVar40) {
                      uVar21 = (ulong)uVar40;
                      goto LAB_00142df8;
                    }
                    uVar21 = (ulong)(int)uVar40;
                    lVar33 = (long)iVar27;
                    if (*(char *)(lVar45 + uVar21) == '\0') {
                      if (*(char *)(lVar45 + 3 + lVar33) == '\0') goto LAB_00142ff6;
                      goto LAB_00143072;
                    }
                    if (*(char *)(lVar47 + 3 + lVar33) != '\0') goto LAB_00143072;
LAB_00142eac:
                    uVar10 = *(undefined4 *)(lVar46 + lVar33 * 4);
                    goto LAB_00143076;
                  }
                  lVar30 = (long)iVar27;
                  lVar13 = lVar30 << 0x20;
                  lVar9 = lVar34 + lVar30 * 4;
                  lVar15 = lVar41 + lVar30;
                  lVar8 = lVar12 + lVar30 * 4;
                  lVar44 = 0;
LAB_001425f6:
                  if (*(char *)(lVar29 + lVar30 + -1 + lVar44) != '\0') {
                    iVar42 = (int)lVar44;
                    iVar14 = (int)(lVar30 + 2);
                    if (*(char *)(lVar15 + -1 + lVar44) != '\0') {
                      uVar26 = (ulong)(uint)(iVar14 + iVar42);
                      *(undefined4 *)(lVar9 + lVar44 * 4) = *(undefined4 *)(lVar8 + -8 + lVar44 * 4)
                      ;
                      goto LAB_00142a2e;
                    }
                    if (*(char *)(lVar29 + lVar30 + lVar44) != '\0') goto code_r0x00142619;
                    uVar40 = iVar14 + iVar42;
                    *(undefined4 *)(lVar9 + lVar44 * 4) = *(undefined4 *)(lVar46 + (lVar13 >> 0x1e))
                    ;
LAB_001428a4:
                    uVar26 = (ulong)uVar40;
                    goto LAB_001428b3;
                  }
                  uVar26 = lVar30 + 2 + lVar44;
                  iVar27 = (int)uVar26;
                  lVar9 = lVar13 + 0x300000000 >> 0x20;
                  uVar21 = lVar30 + 2 + lVar44;
                  if (*(char *)(lVar45 + lVar9) == '\0') goto LAB_00142335;
                  if (*(char *)(lVar47 + lVar9) != '\0') {
LAB_0014252b:
                    do {
                      *(undefined4 *)(lVar46 + uVar21 * 4) = *(undefined4 *)(lVar22 + uVar21 * 4);
                      uVar21 = (long)(int)uVar26 + 2;
                      if (local_180 <= (int)uVar21) {
                        if (local_180 < (int)uVar21) goto LAB_00142df8;
                        if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_00142eb8;
LAB_00142e64:
                        if (*(char *)(lVar47 + 1 + uVar21) == '\0') {
                          uVar10 = *(undefined4 *)(lVar46 + -8 + uVar21 * 4);
                          goto LAB_00142ed4;
                        }
                        if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_00142ed0;
                        uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                        if (*(char *)(lVar31 + uVar21) == '\0') {
                          uVar23 = *(uint *)(lVar46 + -8 + uVar21 * 4);
LAB_00143424:
                          uVar40 = UFPC::Merge(uVar40,uVar23);
LAB_00143430:
                          *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                        }
                        else {
                          *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                        }
                        goto LAB_0014307a;
                      }
                      uVar26 = uVar21;
                      if (*(char *)(lVar45 + uVar21) != '\0') goto LAB_00142b03;
LAB_00142188:
                      iVar27 = (int)uVar26;
                      uVar21 = (ulong)iVar27;
                      if (*(char *)(uVar21 + 1 + lVar45) == '\0') {
                        while( true ) {
                          uVar21 = (ulong)iVar27;
LAB_00142335:
                          *(undefined4 *)(lVar46 + uVar21 * 4) = 0;
                          lVar9 = (long)iVar27;
                          uVar21 = lVar9 + 2;
                          if (local_180 <= (int)uVar21) break;
                          uVar26 = uVar21;
                          if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_00142188;
                          if (*(char *)(lVar9 + 3 + lVar47) != '\0') {
                            if ((*(char *)(lVar47 + uVar21) == '\0') &&
                               (lVar15 = lVar31, *(char *)(lVar18 + lVar9) != '\0'))
                            goto LAB_00142bbe;
                            *(undefined4 *)(lVar46 + 8 + lVar9 * 4) =
                                 *(undefined4 *)(lVar22 + 8 + lVar9 * 4);
                            goto LAB_00142a2e;
                          }
                          if (*(char *)(lVar45 + 3 + lVar9) == '\0') {
                            if (*(char *)(lVar47 + uVar21) == '\0') {
                              if (*(char *)(lVar18 + lVar9) == '\0') {
                                UFPC::P_[UFPC::length_] = UFPC::length_;
                                uVar40 = UFPC::length_ + 1;
                                *(uint *)(lVar46 + 8 + lVar9 * 4) = UFPC::length_;
                                UFPC::length_ = uVar40;
                                goto LAB_001428b3;
                              }
                              uVar10 = *(undefined4 *)(lVar22 + lVar9 * 4);
                            }
                            else {
                              uVar10 = *(undefined4 *)(lVar22 + 8 + lVar9 * 4);
                            }
                            *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = uVar10;
                            goto LAB_001428b3;
                          }
                          cVar1 = *(char *)(lVar9 + 2 + lVar47);
                          if (*(char *)(lVar9 + 4 + lVar47) != '\0') {
                            if (cVar1 != '\0') goto LAB_001421b8;
                            if (*(char *)(lVar18 + lVar9) == '\0') {
                              *(undefined4 *)(lVar46 + 8 + lVar9 * 4) =
                                   *(undefined4 *)(lVar22 + 0x10 + lVar9 * 4);
                            }
                            else {
LAB_00142c8f:
                              if ((*(char *)(lVar31 + 1 + uVar21) == '\0') ||
                                 (*(char *)(lVar31 + uVar21) == '\0')) {
                                uVar40 = UFPC::Merge(*(uint *)(lVar22 + -8 + uVar21 * 4),
                                                     *(uint *)(lVar22 + 8 + uVar21 * 4));
                              }
                              else {
                                uVar40 = *(uint *)(lVar36 + uVar21 * 4);
                              }
                              *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                            }
                            goto LAB_0014258d;
                          }
                          if (cVar1 != '\0') goto LAB_001421ea;
                          if (*(char *)(lVar18 + lVar9) == '\0') {
                            UFPC::P_[UFPC::length_] = UFPC::length_;
                            uVar40 = UFPC::length_;
                            UFPC::length_ = UFPC::length_ + 1;
                          }
                          else {
                            uVar40 = *(uint *)(lVar22 + lVar9 * 4);
                          }
LAB_0014244e:
                          *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                          lVar9 = (long)(int)uVar26;
                          uVar26 = lVar9 + 2;
                          if (local_180 <= (int)uVar26) {
                            uVar21 = uVar26;
                            if (local_180 < (int)uVar26) goto LAB_00142df8;
                            if (*(char *)(lVar45 + uVar26) == '\0') goto LAB_00142fc1;
                            if (*(char *)(lVar47 + 3 + lVar9) == '\0') goto LAB_00143401;
                            uVar40 = UFPC::Merge(*(uint *)(lVar22 + 8 + lVar9 * 4),
                                                 *(uint *)(lVar46 + lVar9 * 4));
                            goto LAB_00143405;
                          }
                          if (*(char *)(lVar45 + uVar26) != '\0') {
                            if (*(char *)(lVar9 + 3 + lVar47) == '\0') {
                              if (*(char *)(lVar45 + 3 + lVar9) == '\0') {
                                *(undefined4 *)(lVar46 + 8 + lVar9 * 4) =
                                     *(undefined4 *)(lVar46 + lVar9 * 4);
                                goto LAB_001428b3;
                              }
                              if (*(char *)(lVar9 + 4 + lVar47) == '\0') {
                                *(undefined4 *)(lVar46 + 8 + lVar9 * 4) =
                                     *(undefined4 *)(lVar46 + lVar9 * 4);
                                goto LAB_0014278b;
                              }
                              uVar40 = UFPC::Merge(*(uint *)(lVar22 + 0x10 + lVar9 * 4),
                                                   *(uint *)(lVar46 + lVar9 * 4));
                              *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
                              goto LAB_0014258d;
                            }
                            uVar40 = UFPC::Merge(*(uint *)(lVar22 + 8 + lVar9 * 4),
                                                 *(uint *)(lVar46 + lVar9 * 4));
                            *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
LAB_00142a2e:
                            while( true ) {
                              iVar27 = (int)uVar26;
                              iVar14 = iVar27 + 2;
                              if (local_180 <= iVar14) break;
                              lVar20 = (long)iVar27;
                              lVar9 = lVar20 + 2;
                              lVar44 = lVar33 + 8 + lVar20 * 4;
                              lVar15 = lVar32 + lVar35 + 2 + lVar20;
                              lVar8 = lVar29 + lVar20;
                              lVar30 = lVar34 + lVar20 * 4;
                              lVar20 = lVar20 << 0x20;
                              lVar13 = 0;
LAB_00142a8c:
                              lVar20 = lVar20 + 0x200000000;
                              iVar14 = (int)lVar9;
                              iVar42 = (int)lVar13;
                              if (*(char *)(lVar8 + -1 + lVar13) == '\0') {
                                uVar26 = (ulong)(uint)(iVar14 + iVar42);
                                goto LAB_00142188;
                              }
                              if (*(char *)(lVar8 + -2 + lVar13) == '\0') {
                                if (*(char *)(lVar15 + 1 + lVar13) == '\0') {
                                  uVar21 = lVar9 + lVar13;
                                  if (*(char *)(lVar13 + lVar8) == '\0') {
                                    if (*(char *)(lVar13 + lVar15) == '\0') {
                                      uVar10 = *(undefined4 *)(lVar44 + -8 + lVar13 * 4);
                                    }
                                    else {
                                      uVar10 = *(undefined4 *)(lVar44 + lVar13 * 4);
                                    }
                                    *(undefined4 *)(lVar30 + lVar13 * 4) = uVar10;
                                    uVar26 = uVar21 & 0xffffffff;
                                    goto LAB_001428b3;
                                  }
                                  if (*(char *)(lVar13 + 2 + lVar15) == '\0') {
                                    if (*(char *)(lVar13 + lVar15) == '\0') {
                                      uVar26 = uVar21 & 0xffffffff;
                                      uVar40 = *(uint *)(lVar44 + -8 + lVar13 * 4);
                                      goto LAB_0014244e;
                                    }
                                    uVar26 = uVar21 & 0xffffffff;
                                    goto LAB_001421ea;
                                  }
                                  if (*(char *)(lVar13 + lVar15) != '\0') {
                                    uVar26 = uVar21 & 0xffffffff;
                                    goto LAB_001421b8;
                                  }
                                  uVar26 = uVar21 & 0xffffffff;
                                  uVar21 = lVar20 >> 0x20;
                                  goto LAB_00142c8f;
                                }
                                if (*(char *)(lVar15 + lVar13) != '\0') goto code_r0x00142ab1;
                                lVar15 = lVar31;
                                uVar21 = lVar20 >> 0x20;
                                uVar26 = (ulong)(uint)(iVar14 + iVar42);
LAB_00142bbe:
                                if (*(char *)(lVar15 + uVar21) == '\0') {
                                  uVar40 = *(uint *)(lVar22 + -8 + uVar21 * 4);
                                  uVar23 = *(uint *)(lVar22 + uVar21 * 4);
LAB_00142bfd:
                                  uVar40 = UFPC::Merge(uVar40,uVar23);
                                }
                                else {
LAB_00142bc4:
                                  uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                                }
                                *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                              }
                              else {
                                uVar26 = (ulong)(uint)(iVar14 + iVar42);
LAB_00142b03:
                                uVar21 = (ulong)(int)uVar26;
                                if (*(char *)(uVar21 + 1 + lVar47) == '\0') {
                                  if (*(char *)(lVar45 + 1 + uVar21) == '\0') {
                                    *(undefined4 *)(lVar46 + uVar21 * 4) =
                                         *(undefined4 *)(lVar46 + -8 + uVar21 * 4);
                                    goto LAB_001428b3;
                                  }
                                  if (*(char *)(uVar21 + 2 + lVar47) != '\0') {
                                    if (*(char *)(lVar31 + 1 + uVar21) == '\0') {
                                      uVar40 = UFPC::Merge(*(uint *)(lVar22 + 8 + uVar21 * 4),
                                                           *(uint *)(lVar46 + -8 + uVar21 * 4));
LAB_00142c7f:
                                      *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                                    }
                                    else {
                                      if (*(char *)(lVar47 + uVar21) != '\0') {
                                        uVar40 = *(uint *)(lVar22 + 8 + uVar21 * 4);
                                        goto LAB_00142c7f;
                                      }
                                      cVar1 = *(char *)(lVar31 + uVar21);
                                      uVar40 = *(uint *)(lVar22 + 8 + uVar21 * 4);
LAB_00142cfe:
                                      if (cVar1 == '\0') {
                                        uVar23 = *(uint *)(lVar46 + -8 + uVar21 * 4);
                                        goto LAB_0014226f;
                                      }
                                      *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                                    }
                                    goto LAB_0014258d;
                                  }
                                  *(undefined4 *)(lVar46 + uVar21 * 4) =
                                       *(undefined4 *)(lVar46 + -8 + uVar21 * 4);
LAB_0014278b:
                                  iVar27 = (int)uVar26;
                                  uVar40 = iVar27 + 2;
                                  if (local_180 <= (int)uVar40) {
LAB_00142d5f:
                                    uVar21 = (ulong)uVar40;
                                    if (local_180 < (int)uVar40) goto LAB_00142df8;
                                    uVar21 = (ulong)(int)uVar40;
                                    uVar26 = (ulong)uVar40;
                                    if (*(char *)(lVar45 + uVar21) != '\0') {
                                      lVar45 = (long)iVar27;
                                      if (*(char *)(lVar47 + 3 + lVar45) == '\0') {
                                        uVar40 = *(uint *)(lVar46 + lVar45 * 4);
                                        goto LAB_00143430;
                                      }
                                      if ((*(char *)(lVar31 + uVar21) == '\0') ||
                                         (*(char *)(lVar47 + lVar45) == '\0')) {
                                        uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                                        uVar23 = *(uint *)(lVar46 + lVar45 * 4);
                                        goto LAB_00143424;
                                      }
                                      goto LAB_00142daf;
                                    }
                                    goto LAB_00142fc1;
                                  }
                                  lVar30 = (long)iVar27;
                                  lVar9 = lVar30 + 2;
                                  lVar44 = lVar30 << 0x20;
                                  lVar15 = lVar34 + lVar30 * 4;
                                  lVar8 = lVar41 + lVar30;
                                  lVar13 = 0;
                                  while( true ) {
                                    if (*(char *)(lVar29 + lVar30 + -1 + lVar13) == '\0') {
                                      uVar26 = (ulong)(uint)((int)lVar9 + (int)lVar13);
                                      goto LAB_00142515;
                                    }
                                    lVar28 = lVar44 >> 0x1e;
                                    lVar20 = lVar44 >> 0x20;
                                    if (*(char *)(lVar8 + -1 + lVar13) != '\0') break;
                                    if (*(char *)(lVar29 + lVar30 + lVar13) == '\0') {
                                      uVar40 = (int)lVar9 + (int)lVar13;
                                      *(undefined4 *)(lVar15 + lVar13 * 4) =
                                           *(undefined4 *)(lVar46 + lVar28);
                                      goto LAB_001428a4;
                                    }
                                    if (*(char *)(lVar8 + lVar13) != '\0') {
                                      if (*(char *)(lVar13 + lVar17 + lVar30) == '\0') {
                                        uVar40 = UFPC::Merge(*(uint *)(lVar12 + lVar30 * 4 +
                                                                      lVar13 * 4),
                                                             *(uint *)(lVar46 + lVar28));
                                        *(uint *)(lVar15 + lVar13 * 4) = uVar40;
                                      }
                                      else {
                                        if (*(char *)(lVar13 + -1 + lVar17 + lVar30) == '\0') {
                                          uVar40 = *(uint *)(lVar12 + lVar30 * 4 + lVar13 * 4);
                                          uVar23 = *(uint *)(lVar46 + lVar28);
                                        }
                                        else {
                                          if (*(char *)(lVar47 + lVar20) != '\0') {
                                            uVar21 = lVar44 + 0x200000000 >> 0x20;
                                            uVar26 = lVar9 + lVar13 & 0xffffffff;
LAB_00142923:
                                            cVar1 = *(char *)(lVar16 + uVar21);
                                            uVar40 = *(uint *)(lVar36 + uVar21 * 4);
                                            goto LAB_00142cfe;
                                          }
                                          uVar40 = *(uint *)(lVar12 + lVar30 * 4 + lVar13 * 4);
                                          uVar23 = *(uint *)(lVar46 + lVar20 * 4);
                                        }
                                        uVar40 = UFPC::Merge(uVar40,uVar23);
                                        *(uint *)(lVar15 + lVar13 * 4) = uVar40;
                                      }
                                      uVar26 = lVar9 + lVar13 & 0xffffffff;
                                      goto LAB_0014258d;
                                    }
                                    *(undefined4 *)(lVar15 + lVar13 * 4) =
                                         *(undefined4 *)(lVar15 + -8 + lVar13 * 4);
                                    lVar44 = lVar44 + 0x200000000;
                                    lVar20 = lVar13 + lVar9;
                                    lVar13 = lVar13 + 2;
                                    if ((long)uVar25 <= lVar20 + 2) {
                                      uVar40 = iVar27 + (int)lVar13 + 2;
                                      iVar27 = iVar27 + (int)lVar13;
                                      goto LAB_00142d5f;
                                    }
                                  }
                                  if (*(char *)(lVar13 + -1 + lVar17 + lVar30) != '\0') {
                                    if (*(char *)(lVar47 + lVar20) == '\0') {
                                      uVar40 = *(uint *)(lVar12 + lVar30 * 4 + -8 + lVar13 * 4);
                                      uVar23 = *(uint *)(lVar46 + lVar20 * 4);
                                      goto LAB_001429a6;
                                    }
                                    lVar15 = lVar16;
                                    uVar21 = lVar44 + 0x200000000 >> 0x20;
                                    uVar26 = lVar9 + lVar13 & 0xffffffff;
                                    goto LAB_00142bbe;
                                  }
                                  uVar40 = *(uint *)(lVar12 + lVar30 * 4 + -8 + lVar13 * 4);
                                  uVar23 = *(uint *)(lVar46 + lVar28);
LAB_001429a6:
                                  uVar40 = UFPC::Merge(uVar40,uVar23);
                                  *(uint *)(lVar15 + lVar13 * 4) = uVar40;
                                  uVar26 = lVar9 + lVar13 & 0xffffffff;
                                }
                                else {
                                  if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_00142bc4;
                                  uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                                  if (*(char *)(lVar31 + uVar21) == '\0') {
                                    uVar23 = *(uint *)(lVar46 + -8 + uVar21 * 4);
                                    goto LAB_00142bfd;
                                  }
                                  *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                                }
                              }
                            }
LAB_00142e2a:
                            uVar21 = (ulong)iVar14;
                            if (local_180 < iVar14) {
                              if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_00142ff6;
                              lVar33 = (long)iVar27;
                              if (*(char *)(lVar45 + 1 + lVar33) != '\0') goto LAB_00142eac;
                            }
                            else {
                              if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_00142eb8;
                              if (*(char *)(lVar45 + 1 + (long)iVar27) != '\0') goto LAB_00142e64;
                              if (*(char *)(lVar47 + 3 + (long)iVar27) != '\0') {
                                if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_00143072;
                                goto LAB_00143049;
                              }
                            }
                            if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_00143072;
                            uVar10 = *(undefined4 *)(lVar22 + (long)iVar27 * 4);
                            goto LAB_00143076;
                          }
LAB_00142515:
                          iVar27 = (int)uVar26;
                          uVar21 = (ulong)iVar27;
                          if (*(char *)(uVar21 + 1 + lVar45) != '\0') {
                            if (*(char *)(lVar47 + 1 + uVar21) != '\0') goto LAB_0014252b;
                            uVar21 = (ulong)iVar27;
                            if (*(char *)(uVar21 + 2 + lVar47) != '\0') goto LAB_0014255d;
LAB_00142568:
                            UFPC::P_[UFPC::length_] = UFPC::length_;
                            uVar40 = UFPC::length_;
                            UFPC::length_ = UFPC::length_ + 1;
                            goto LAB_0014244e;
                          }
                        }
                        if (local_180 < (int)uVar21) {
                          if (*(char *)(lVar45 + uVar21) == '\0') {
                            *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = 0;
                            goto LAB_0014307a;
                          }
LAB_001433bd:
                          if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_001433c5;
                          if (*(char *)(lVar47 + 1 + lVar9) == '\0') {
                            UFPC::P_[UFPC::length_] = UFPC::length_;
                            uVar40 = UFPC::length_ + 1;
                            *(uint *)(lVar46 + 8 + lVar9 * 4) = UFPC::length_;
                            UFPC::length_ = uVar40;
                            goto LAB_0014307a;
                          }
                          uVar10 = *(undefined4 *)(lVar22 + lVar9 * 4);
                        }
                        else {
                          if (*(char *)(lVar45 + uVar21) == '\0') goto LAB_00142eb8;
                          if (*(char *)(lVar47 + 3 + lVar9) == '\0') goto LAB_001433bd;
                          if ((*(char *)(lVar47 + uVar21) == '\0') &&
                             (*(char *)(lVar47 + 1 + lVar9) != '\0')) {
LAB_00143049:
                            if (*(char *)(lVar31 + uVar21) != '\0') goto LAB_00142ed0;
                            uVar40 = *(uint *)(lVar22 + -8 + uVar21 * 4);
                            uVar23 = *(uint *)(lVar22 + uVar21 * 4);
                            goto LAB_00143424;
                          }
LAB_001433c5:
                          uVar10 = *(undefined4 *)(lVar22 + 8 + lVar9 * 4);
                        }
                        *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = uVar10;
                        goto LAB_0014307a;
                      }
                    } while (*(char *)(lVar47 + 1 + uVar21) != '\0');
                    goto LAB_001421a2;
                  }
                  if (*(char *)(lVar47 + 4 + (lVar13 >> 0x20)) == '\0') goto LAB_001421ea;
LAB_001421b8:
                  uVar21 = (ulong)(int)uVar26;
                  if (*(char *)(lVar31 + 1 + uVar21) == '\0') {
                    uVar40 = *(uint *)(lVar22 + uVar21 * 4);
                    uVar23 = *(uint *)(lVar22 + 8 + uVar21 * 4);
LAB_0014226f:
                    uVar40 = UFPC::Merge(uVar40,uVar23);
                  }
                  else {
                    uVar40 = *(uint *)(lVar36 + uVar21 * 4);
                  }
                  *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                } while( true );
              }
              *(undefined4 *)(lVar46 + 8 + lVar9 * 4) = *(undefined4 *)(lVar46 + lVar9 * 4);
              goto LAB_001428b3;
            }
            if (local_180 < (int)uVar21) {
LAB_00142df8:
              uVar21 = (ulong)(int)uVar21;
              if (*(char *)(lVar45 + uVar21) != '\0') {
                uVar10 = *(undefined4 *)(lVar46 + -8 + uVar21 * 4);
LAB_00143076:
                *(undefined4 *)(lVar46 + uVar21 * 4) = uVar10;
                goto LAB_0014307a;
              }
            }
            else {
              if (*(char *)(lVar45 + uVar21) != '\0') {
                if (*(char *)(lVar47 + 3 + lVar9) == '\0') {
LAB_00143401:
                  uVar40 = *(uint *)(lVar46 + lVar9 * 4);
LAB_00143405:
                  *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
                }
                else if (*(char *)(lVar31 + uVar21) == '\0') {
                  uVar40 = UFPC::Merge(*(uint *)(lVar22 + 8 + lVar9 * 4),
                                       *(uint *)(lVar46 + lVar9 * 4));
                  *(uint *)(lVar46 + 8 + lVar9 * 4) = uVar40;
                }
                else {
LAB_00142daf:
                  if (*(char *)(lVar31 + -1 + uVar21) == '\0') {
                    uVar40 = UFPC::Merge(*(uint *)(lVar22 + -8 + uVar21 * 4),
                                         *(uint *)(lVar22 + uVar21 * 4));
                    *(uint *)(lVar46 + uVar21 * 4) = uVar40;
                  }
                  else {
                    *(undefined4 *)(lVar46 + uVar21 * 4) = *(undefined4 *)(lVar22 + uVar21 * 4);
                  }
                }
                goto LAB_0014307a;
              }
LAB_00142fc1:
              uVar21 = (ulong)(int)uVar26;
              if (*(char *)(uVar21 + 1 + lVar45) != '\0') {
                if (*(char *)(lVar47 + 1 + uVar21) != '\0') {
LAB_00143072:
                  uVar10 = *(undefined4 *)(lVar22 + uVar21 * 4);
                  goto LAB_00143076;
                }
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar40 = UFPC::length_ + 1;
                *(uint *)(lVar46 + uVar21 * 4) = UFPC::length_;
                UFPC::length_ = uVar40;
                goto LAB_0014307a;
              }
            }
LAB_00142ff6:
            *(undefined4 *)(lVar46 + uVar21 * 4) = 0;
            goto LAB_0014307a;
          }
          if (*(char *)(lVar47 + lVar9) == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar40 = UFPC::length_ + 1;
            *(uint *)(lVar46 + lVar9 * 4) = UFPC::length_;
            UFPC::length_ = uVar40;
          }
          else {
            *(undefined4 *)(lVar46 + lVar9 * 4) = *(undefined4 *)(lVar22 + lVar9 * 4);
          }
LAB_001428b3:
          iVar27 = (int)uVar26;
          uVar40 = iVar27 + 2;
          uVar26 = (ulong)uVar40;
        } while ((int)uVar40 < local_180);
      }
      uVar21 = (ulong)(int)uVar40;
      if (local_180 < (int)uVar40) {
        if (*(char *)(lVar45 + uVar21) == '\0') {
LAB_00142edd:
          *(undefined4 *)(lVar46 + uVar21 * 4) = 0;
        }
        else {
LAB_00142ec8:
          if (*(char *)(lVar47 + uVar21) != '\0') goto LAB_00142ed0;
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar40 = UFPC::length_ + 1;
          *(uint *)(lVar46 + uVar21 * 4) = UFPC::length_;
          UFPC::length_ = uVar40;
        }
      }
      else {
        if (*(char *)(lVar45 + uVar21) == '\0') {
LAB_00142eb8:
          if (*(char *)(lVar45 + 1 + uVar21) == '\0') goto LAB_00142edd;
        }
        if (*(char *)(lVar47 + 1 + uVar21) == '\0') goto LAB_00142ec8;
LAB_00142ed0:
        uVar10 = *(undefined4 *)(lVar22 + uVar21 * 4);
LAB_00142ed4:
        *(undefined4 *)(lVar46 + uVar21 * 4) = uVar10;
      }
    }
  }
LAB_0014307a:
  puVar7 = UFPC::P_;
  uVar40 = 1;
  if (1 < UFPC::length_) {
    uVar40 = 1;
    uVar25 = 1;
    do {
      if (puVar7[uVar25] < uVar25) {
        uVar23 = puVar7[puVar7[uVar25]];
      }
      else {
        uVar23 = uVar40;
        uVar40 = uVar40 + 1;
      }
      puVar7[uVar25] = uVar23;
      uVar25 = uVar25 + 1;
    } while (uVar25 < UFPC::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar40;
  puVar7 = UFPC::P_;
  uVar25 = 0;
  iVar27 = (int)(uVar11 & 0xfffffffffffffffe);
  if (0 < (int)uVar48) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar32 = *(long *)&pMVar4->field_0x10;
    lVar17 = **(long **)&pMVar4->field_0x48;
    lVar12 = *(long *)&pMVar5->field_0x10;
    lVar47 = **(long **)&pMVar5->field_0x48;
    lVar33 = lVar12 + lVar47;
    lVar46 = lVar32 + 1 + lVar17;
    lVar45 = lVar32 + 1;
    uVar25 = 0;
    lVar22 = lVar12;
    do {
      puVar6 = UFPC::P_;
      lVar36 = lVar47 * uVar25 + lVar12;
      lVar18 = lVar36 + lVar47;
      if (iVar27 < 1) {
        uVar26 = 0;
      }
      else {
        uVar26 = 0;
        do {
          lVar31 = (long)*(int *)(lVar22 + uVar26 * 4);
          if (lVar31 < 1) {
            *(undefined8 *)(lVar22 + uVar26 * 4) = 0;
            uVar21 = uVar26 + 1;
            *(undefined4 *)(lVar33 + uVar26 * 4) = 0;
            uVar40 = 0;
          }
          else {
            uVar40 = puVar6[lVar31];
            uVar23 = uVar40;
            if (*(char *)(lVar45 + -1 + uVar26) == '\0') {
              uVar23 = 0;
            }
            *(uint *)(lVar22 + uVar26 * 4) = uVar23;
            uVar21 = uVar26 | 1;
            uVar23 = uVar40;
            if (*(char *)(lVar45 + uVar26) == '\0') {
              uVar23 = 0;
            }
            *(uint *)(lVar22 + 4 + uVar26 * 4) = uVar23;
            uVar23 = uVar40;
            if (*(char *)(lVar46 + -1 + uVar26) == '\0') {
              uVar23 = 0;
            }
            *(uint *)(lVar33 + uVar26 * 4) = uVar23;
            if (*(char *)(lVar46 + uVar26) == '\0') {
              uVar40 = 0;
            }
          }
          *(uint *)(lVar18 + uVar21 * 4) = uVar40;
          uVar26 = uVar26 + 2;
        } while ((long)uVar26 < (long)(uVar11 & 0xfffffffffffffffe));
      }
      if ((uVar3 & 0x80000001) == 1) {
        lVar31 = (long)*(int *)(lVar36 + uVar26 * 4);
        if (lVar31 < 1) {
          *(undefined4 *)(lVar36 + uVar26 * 4) = 0;
          *(undefined4 *)(lVar18 + uVar26 * 4) = 0;
        }
        else {
          lVar16 = lVar17 * uVar25 + lVar32;
          uVar40 = puVar7[lVar31];
          uVar23 = uVar40;
          if (*(char *)(lVar16 + uVar26) == '\0') {
            uVar23 = 0;
          }
          *(uint *)(lVar36 + uVar26 * 4) = uVar23;
          if (*(char *)(lVar16 + lVar17 + uVar26) == '\0') {
            *(undefined4 *)(lVar18 + uVar26 * 4) = 0;
          }
          else {
            *(uint *)(lVar18 + uVar26 * 4) = uVar40;
          }
        }
      }
      uVar25 = uVar25 + 2;
      lVar33 = lVar33 + lVar47 * 2;
      lVar46 = lVar46 + lVar17 * 2;
      lVar45 = lVar45 + lVar17 * 2;
      lVar22 = lVar22 + lVar47 * 2;
    } while (uVar25 < uVar48);
    uVar25 = uVar25 & 0xffffffff;
  }
  puVar7 = UFPC::P_;
  if ((uVar2 & 0x80000001) == 1) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar45 = *(long *)&pMVar4->field_0x10;
    lVar32 = **(long **)&pMVar4->field_0x48 * uVar25;
    lVar46 = *(long *)&pMVar5->field_0x10;
    lVar33 = uVar25 * **(long **)&pMVar5->field_0x48;
    if (iVar27 < 1) {
      uVar25 = 0;
    }
    else {
      lVar17 = lVar32 + lVar45;
      lVar12 = lVar33 + lVar46;
      uVar25 = 0;
      do {
        lVar47 = (long)*(int *)(lVar12 + uVar25 * 4);
        if (lVar47 < 1) {
          *(undefined8 *)(lVar12 + uVar25 * 4) = 0;
        }
        else {
          uVar2 = puVar7[lVar47];
          uVar48 = uVar2;
          if (*(char *)(lVar17 + uVar25) == '\0') {
            uVar48 = 0;
          }
          *(uint *)(lVar12 + uVar25 * 4) = uVar48;
          if (*(char *)(lVar17 + 1 + uVar25) == '\0') {
            *(undefined4 *)(lVar12 + 4 + uVar25 * 4) = 0;
          }
          else {
            *(uint *)(lVar12 + 4 + uVar25 * 4) = uVar2;
          }
        }
        uVar25 = uVar25 + 2;
      } while (uVar25 < (uVar11 & 0xfffffffe));
    }
    puVar7 = UFPC::P_;
    if ((uVar3 & 0x80000001) == 1) {
      lVar46 = lVar46 + lVar33;
      lVar33 = (long)*(int *)(lVar46 + uVar25 * 4);
      if ((0 < lVar33) && (*(char *)(lVar45 + lVar32 + uVar25) != '\0')) {
        *(uint *)(lVar46 + uVar25 * 4) = UFPC::P_[lVar33];
        goto LAB_0014336a;
      }
      *(undefined4 *)(lVar46 + uVar25 * 4) = 0;
    }
  }
  puVar7 = UFPC::P_;
  if (UFPC::P_ == (uint *)0x0) {
    return;
  }
LAB_0014336a:
  operator_delete__(puVar7);
  return;
code_r0x0013ec2c:
  uVar26 = lVar12 + lVar36 & 0xffffffff;
  goto LAB_0013eb75;
LAB_00141a8f:
  local_140 = lVar34 + lVar30;
  if (*(char *)(lVar30 + 2 + lVar37 + lVar17) == '\0') goto LAB_0013f071;
  lVar15 = lVar20 + 0x300000000 >> 0x20;
  lVar8 = lVar20 + 0x100000000 >> 0x20;
  if (*(char *)(lVar33 + lVar15) == '\0') {
    if (*(char *)(lVar32 + lVar8) != '\0') {
      *(undefined4 *)(lVar9 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar43);
      goto LAB_0013fdcb;
    }
    if (*(char *)(lVar33 + lVar8) != '\0') {
      *(undefined4 *)(lVar9 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar43);
      goto LAB_0013fdcb;
    }
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar40 = UFPC::length_ + 1;
    *(uint *)(lVar9 + lVar47 + 8 + lVar30 * 4) = UFPC::length_;
    UFPC::length_ = uVar40;
    goto LAB_0013fdcb;
  }
  uVar19 = local_140;
  if (*(char *)(lVar33 + lVar8) != '\0') {
    uVar21 = lVar20 + 0x200000000 >> 0x20;
    goto LAB_00141b21;
  }
  if (*(char *)(lVar32 + lVar8) == '\0') goto LAB_0013f083;
  if (*(char *)(lVar16 + lVar15) != '\0') goto LAB_00141b30;
  if (*(char *)(lVar16 + 4 + lVar24) != '\0') {
    uVar21 = lVar20 + 0x200000000 >> 0x20;
    goto LAB_00140eca;
  }
  if (*(char *)(lVar30 + 2 + lVar28 + lVar17) != '\0') {
LAB_00141d48:
    local_140 = lVar34 + lVar30;
    *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar35 + lVar47 + 8 + lVar30 * 4);
    goto LAB_0013f0ed;
  }
  *(undefined4 *)(lVar44 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar24 * 4);
LAB_00141f01:
  local_140 = lVar34 + lVar30;
LAB_0014053f:
  lVar34 = (long)(int)local_140;
  uVar19 = lVar34 + 2;
  iVar27 = (int)uVar19;
  if (iVar27 < local_180) {
    if (*(char *)(lVar33 + uVar19) == '\0') {
      if (*(char *)(lVar32 + uVar19) == '\0') goto LAB_0014067f;
      if (*(char *)(lVar34 + 3 + lVar33) == '\0') goto LAB_00140744;
      if (*(char *)(lVar16 + 3 + lVar34) != '\0') {
        uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),*(uint *)(lVar36 + lVar34 * 4));
        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
        goto LAB_00140de9;
      }
    }
    else {
      if (*(char *)(lVar34 + 3 + lVar16) != '\0') {
        uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),*(uint *)(lVar36 + lVar34 * 4));
        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
        goto LAB_001417c6;
      }
      if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
        *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
        goto LAB_00140f27;
      }
    }
    if (*(char *)(lVar34 + 4 + lVar16) != '\0') {
      uVar40 = UFPC::Merge(*(uint *)(lVar31 + 0x10 + lVar34 * 4),*(uint *)(lVar36 + lVar34 * 4));
      *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
      local_140 = uVar19 & 0xffffffff;
      goto LAB_0013f1f0;
    }
    *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
    local_140 = uVar19 & 0xffffffff;
LAB_001407b8:
    iVar14 = (int)local_140;
    uVar40 = iVar14 + 2;
    if ((int)uVar40 < local_180) {
      lVar9 = (long)iVar14;
      lVar34 = lVar9 + 2;
      lVar20 = lVar9 << 0x20;
      lVar35 = lVar18 + lVar9 * 4;
      lVar30 = lVar47 + lVar35 + 8;
      lVar15 = lVar41 + lVar9 + lVar17;
      lVar8 = lVar15 + 3;
      lVar13 = lVar12 * lVar46 + lVar9 + lVar17;
      lVar44 = 0;
LAB_00140840:
      iVar27 = (int)lVar34;
      lVar37 = lVar20 >> 0x1e;
      iVar42 = (int)lVar44;
      lVar28 = lVar20 >> 0x20;
      if (*(char *)(lVar15 + 2 + lVar44) == '\0') {
        if (*(char *)(lVar12 * lVar45 + lVar9 + lVar17 + 2 + lVar44) == '\0') {
          uVar19 = (ulong)(uint)(iVar27 + iVar42);
          goto LAB_0014067f;
        }
        if (*(char *)(lVar8 + lVar44) == '\0') {
          *(undefined4 *)(lVar35 + lVar47 + 8 + lVar44 * 4) = *(undefined4 *)(lVar36 + lVar37);
          local_140 = (ulong)(uint)(iVar27 + iVar42);
          goto LAB_0013fdcb;
        }
        if (*(char *)(lVar13 + 3 + lVar44) != '\0') {
          uVar19 = lVar34 + lVar44;
          if (*(char *)(lVar44 + 2 + lVar12 * local_118 + lVar9 + lVar17) == '\0') {
            uVar40 = UFPC::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 8 + lVar44 * 4)
                                 ,*(uint *)(lVar36 + lVar37));
          }
          else {
            if (*(char *)(lVar16 + lVar28) != '\0') {
              uVar21 = lVar20 + 0x200000000 >> 0x20;
              goto LAB_00140bc2;
            }
            uVar40 = UFPC::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 8 + lVar44 * 4)
                                 ,*(uint *)(lVar36 + lVar28 * 4));
          }
          *(uint *)(lVar30 + lVar44 * 4) = uVar40;
          goto LAB_00140de9;
        }
      }
      else {
        if (*(char *)(lVar13 + 3 + lVar44) != '\0') {
          uVar19 = lVar34 + lVar44;
          if (*(char *)(lVar44 + 2 + lVar12 * local_118 + lVar9 + lVar17) == '\0') {
            uVar40 = UFPC::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 8 + lVar44 * 4)
                                 ,*(uint *)(lVar36 + lVar37));
          }
          else {
            if (*(char *)(lVar16 + lVar28) != '\0') {
              uVar21 = lVar20 + 0x200000000 >> 0x20;
LAB_0013f128:
              uVar40 = *(uint *)(lVar31 + uVar21 * 4);
              if (*(char *)(lVar29 + -1 + uVar21) == '\0') {
                uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
                *(uint *)(lVar36 + uVar21 * 4) = uVar40;
              }
              else {
                *(uint *)(lVar36 + uVar21 * 4) = uVar40;
              }
              goto LAB_001417c6;
            }
            uVar40 = UFPC::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 8 + lVar44 * 4)
                                 ,*(uint *)(lVar36 + lVar28 * 4));
          }
          *(uint *)(lVar30 + lVar44 * 4) = uVar40;
          goto LAB_001417c6;
        }
        if (*(char *)(lVar8 + lVar44) == '\0') {
          iVar27 = iVar27 + iVar42;
          *(undefined4 *)(lVar35 + lVar47 + 8 + lVar44 * 4) = *(undefined4 *)(lVar36 + lVar37);
          goto LAB_00140f27;
        }
      }
      if (*(char *)(lVar13 + 4 + lVar44) != '\0') {
        if (((*(char *)(lVar29 + 3 + lVar28) == '\0') ||
            (*(char *)(lVar44 + 2 + lVar12 * local_118 + lVar9 + lVar17) == '\0')) ||
           (*(char *)(lVar16 + lVar28) == '\0')) {
          uVar40 = UFPC::Merge(*(uint *)(lVar22 * local_118 + lVar9 * 4 + lVar47 + 0x10 + lVar44 * 4
                                        ),*(uint *)(lVar36 + lVar28 * 4));
          *(uint *)(lVar30 + lVar44 * 4) = uVar40;
          local_140 = lVar34 + lVar44 & 0xffffffff;
          goto LAB_0013f1f0;
        }
        uVar19 = lVar20 + 0x200000000 >> 0x20;
        local_140 = lVar34 + lVar44;
LAB_0014099f:
        local_140 = local_140 & 0xffffffff;
        uVar40 = *(uint *)(lVar31 + 8 + uVar19 * 4);
        if (*(char *)(lVar29 + -1 + uVar19) == '\0') {
          uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar19 * 4));
          *(uint *)(lVar36 + uVar19 * 4) = uVar40;
        }
        else {
          *(uint *)(lVar36 + uVar19 * 4) = uVar40;
        }
LAB_0013f1f0:
        iVar14 = (int)local_140;
        uVar40 = iVar14 + 2;
        if (local_180 <= (int)uVar40) {
LAB_0013f411:
          local_140 = (ulong)uVar40;
          if (local_180 < (int)uVar40) goto LAB_00140e1e;
          if (*(char *)(lVar33 + local_140) == '\0') {
            lVar17 = (long)iVar14;
            cVar1 = *(char *)(lVar33 + 3 + lVar17);
            if (*(char *)(lVar32 + local_140) == '\0') {
              if (cVar1 == '\0') goto LAB_0013f90c;
              uVar10 = *(undefined4 *)(lVar31 + local_140 * 4);
              goto LAB_00141a64;
            }
            if (cVar1 == '\0') goto LAB_00141a61;
          }
          lVar17 = (long)iVar14;
          if (*(char *)(lVar16 + 3 + lVar17) == '\0') goto LAB_00141a61;
          goto LAB_0013efd8;
        }
        lVar13 = (long)iVar14;
        lVar20 = lVar13 << 0x20;
        lVar9 = lVar17 + 3 + lVar41 + lVar13;
        lVar8 = lVar12 * lVar46 + lVar13 + lVar17;
        lVar34 = lVar47 + lVar22 * local_118 + lVar13 * 4;
        lVar44 = lVar34 + 8;
        lVar35 = lVar18 + lVar13 * 4;
        lVar15 = lVar47 + 8 + lVar35;
        lVar30 = 0;
LAB_0013f308:
        lVar28 = lVar20 >> 0x1e;
        iVar42 = (int)lVar30;
        iVar27 = (int)(lVar13 + 2);
        if (*(char *)(lVar9 + -1 + lVar30) == '\0') {
          if (*(char *)(lVar12 * lVar45 + lVar13 + lVar17 + 2 + lVar30) == '\0') {
            uVar19 = lVar13 + 2 + lVar30;
            lVar34 = lVar20 + 0x300000000 >> 0x20;
            if (*(char *)(lVar33 + lVar34) == '\0') {
              iVar27 = (int)uVar19;
              goto LAB_0013f7a6;
            }
            if (*(char *)(lVar16 + lVar34) != '\0') goto LAB_0013f6c9;
            if (*(char *)(lVar16 + 4 + (lVar20 >> 0x20)) == '\0') {
              *(undefined4 *)(lVar15 + lVar30 * 4) = *(undefined4 *)(lVar44 + lVar30 * 4);
              local_140 = uVar19 & 0xffffffff;
              goto LAB_0013f0ed;
            }
            local_140 = uVar19 & 0xffffffff;
LAB_0013f0c0:
            lVar34 = (long)(int)local_140;
            if (*(char *)(lVar29 + 1 + lVar34) == '\0') {
              uVar40 = UFPC::Merge(*(uint *)(lVar31 + lVar34 * 4),*(uint *)(lVar31 + 8 + lVar34 * 4)
                                  );
            }
            else {
              uVar40 = *(uint *)(lVar31 + 8 + lVar34 * 4);
            }
            *(uint *)(lVar36 + lVar34 * 4) = uVar40;
            goto LAB_0013f1f0;
          }
          if (*(char *)(lVar9 + lVar30) == '\0') {
            uVar40 = iVar27 + iVar42;
            *(undefined4 *)(lVar35 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar28);
            goto LAB_0014074b;
          }
          if (*(char *)(lVar8 + 3 + lVar30) != '\0') goto LAB_0013f6c6;
        }
        else {
          if (*(char *)(lVar8 + 3 + lVar30) != '\0') {
            *(undefined4 *)(lVar15 + lVar30 * 4) = *(undefined4 *)(lVar44 + lVar30 * 4);
            uVar19 = (ulong)(uint)(iVar27 + iVar42);
            goto LAB_001417c6;
          }
          if (*(char *)(lVar9 + lVar30) == '\0') {
            iVar27 = iVar27 + iVar42;
            *(undefined4 *)(lVar35 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar28);
            goto LAB_00140f27;
          }
        }
        if (*(char *)(lVar8 + 4 + lVar30) == '\0') {
          *(undefined4 *)(lVar35 + lVar47 + 8 + lVar30 * 4) = *(undefined4 *)(lVar36 + lVar28);
          local_140 = (ulong)(uint)(iVar27 + iVar42);
          goto LAB_001407b8;
        }
        uVar40 = *(uint *)(lVar34 + 0x10 + lVar30 * 4);
        if (*(char *)(lVar12 * local_118 + lVar13 + lVar17 + 3 + lVar30) == '\0') {
          uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar15 + -8 + lVar30 * 4));
        }
        *(uint *)(lVar15 + lVar30 * 4) = uVar40;
        lVar20 = lVar20 + 0x200000000;
        lVar28 = lVar13 + lVar30;
        lVar30 = lVar30 + 2;
        if ((long)uVar25 <= lVar28 + 4) {
          iVar14 = iVar14 + (int)lVar30;
          uVar40 = iVar27 + (int)lVar30;
          goto LAB_0013f411;
        }
        goto LAB_0013f308;
      }
      *(undefined4 *)(lVar30 + lVar44 * 4) = *(undefined4 *)(lVar47 + lVar35 + lVar44 * 4);
      lVar20 = lVar20 + 0x200000000;
      lVar28 = lVar34 + lVar44;
      lVar44 = lVar44 + 2;
      if ((long)uVar25 <= lVar28 + 2) {
        iVar14 = iVar14 + (int)lVar44;
        uVar40 = iVar27 + (int)lVar44;
        goto LAB_001408d3;
      }
      goto LAB_00140840;
    }
LAB_001408d3:
    uVar19 = (ulong)uVar40;
    if (local_180 < (int)uVar40) goto LAB_00140e1e;
    if (*(char *)(lVar33 + uVar19) == '\0') {
      if (*(char *)(lVar32 + uVar19) == '\0') goto LAB_00140b3d;
      if (*(char *)(lVar33 + 3 + (long)iVar14) == '\0') {
        uVar10 = *(undefined4 *)(lVar36 + (long)iVar14 * 4);
        goto LAB_00141a2a;
      }
    }
    lVar33 = (long)iVar14;
    if (*(char *)(lVar16 + 3 + lVar33) == '\0') {
      *(undefined4 *)(lVar36 + uVar19 * 4) = *(undefined4 *)(lVar36 + lVar33 * 4);
      goto LAB_00141a6c;
    }
    local_140 = uVar19;
    if (*(char *)(lVar29 + uVar19) == '\0') {
      uVar40 = *(uint *)(lVar31 + uVar19 * 4);
      uVar23 = *(uint *)(lVar36 + lVar33 * 4);
LAB_001412f3:
      uVar40 = UFPC::Merge(uVar40,uVar23);
      *(uint *)(lVar36 + uVar19 * 4) = uVar40;
      goto LAB_00141a6c;
    }
LAB_00141222:
    lVar33 = (long)(int)local_140;
    uVar19 = local_140;
    if (*(char *)(lVar33 + -2 + lVar16) == '\0') {
      uVar40 = *(uint *)(lVar31 + lVar33 * 4);
    }
    else {
LAB_00141230:
      lVar33 = (long)(int)uVar19;
      uVar40 = *(uint *)(lVar31 + lVar33 * 4);
      if (*(char *)(lVar29 + -1 + lVar33) != '\0') {
        *(uint *)(lVar36 + lVar33 * 4) = uVar40;
        goto LAB_00141a6c;
      }
    }
    uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar33 * 4));
    *(uint *)(lVar36 + lVar33 * 4) = uVar40;
    goto LAB_00141a6c;
  }
  if (local_180 < iVar27) {
LAB_001405b5:
    uVar40 = (uint)uVar19;
LAB_00140e1e:
    local_140 = (ulong)(int)uVar40;
    if (*(char *)(lVar33 + local_140) == '\0') {
LAB_00140e28:
      if (*(char *)(lVar32 + local_140) == '\0') goto LAB_001419d4;
    }
    uVar10 = *(undefined4 *)(lVar36 + -8 + local_140 * 4);
    goto LAB_00141a64;
  }
  uVar21 = uVar19 & 0xffffffff;
  if (*(char *)(lVar33 + uVar21) == '\0') {
    if (*(char *)(lVar32 + uVar21) == '\0') {
LAB_00140b3d:
      uVar40 = (uint)uVar19;
      local_140 = (ulong)(int)uVar40;
      if (*(char *)(local_140 + 1 + lVar33) == '\0') goto LAB_0013f90c;
      cVar1 = *(char *)(lVar16 + 1 + local_140);
      goto joined_r0x00140b59;
    }
    if (*(char *)(lVar33 + 3 + lVar34) != '\0') goto LAB_001405d0;
  }
  else {
LAB_001405d0:
    if (*(char *)(lVar16 + 3 + lVar34) != '\0') {
      uVar40 = UFPC::Merge(*(uint *)(lVar31 + uVar21 * 4),*(uint *)(lVar36 + lVar34 * 4));
LAB_001405f2:
      *(uint *)(lVar36 + uVar21 * 4) = uVar40;
      goto LAB_00141a6c;
    }
  }
LAB_00140738:
  *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
  goto LAB_00141a6c;
LAB_0013f6c6:
  uVar19 = (ulong)(uint)(iVar27 + iVar42);
LAB_0013f6c9:
  *(undefined4 *)(lVar15 + lVar30 * 4) = *(undefined4 *)(lVar44 + lVar30 * 4);
LAB_00140de9:
  lVar34 = (long)(int)uVar19;
  local_140 = lVar34 + 2;
  uVar40 = (uint)local_140;
  if (local_180 <= (int)uVar40) {
    if (local_180 < (int)uVar40) goto LAB_00140e1e;
    uVar21 = local_140 & 0xffffffff;
    if (*(char *)(lVar33 + uVar21) != '\0') goto LAB_00141a0f;
    if (*(char *)(lVar32 + uVar21) == '\0') goto LAB_00141c4e;
    if (*(char *)(lVar33 + 3 + lVar34) != '\0') goto LAB_00141a0f;
    *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
    goto LAB_00141a6c;
  }
  if (*(char *)(lVar33 + local_140) != '\0') goto LAB_00140e7b;
  if (*(char *)(lVar32 + local_140) == '\0') goto LAB_0013f071;
  if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
    *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
LAB_0013fdcb:
    lVar34 = (long)(int)local_140;
    uVar21 = lVar34 + 2;
    iVar27 = (int)uVar21;
    if (iVar27 < local_180) {
      if (*(char *)(lVar33 + uVar21) == '\0') goto LAB_0013fbc8;
      local_140 = uVar21;
      if (*(char *)(lVar32 + 1 + lVar34) != '\0') goto LAB_0013fe09;
LAB_0013f990:
      iVar27 = (int)local_140;
      lVar34 = (long)iVar27;
      if (*(char *)(lVar34 + 1 + lVar16) == '\0') {
        if (*(char *)(lVar33 + 1 + lVar34) == '\0') {
          lVar34 = (long)iVar27;
          if (*(char *)(lVar16 + lVar34) != '\0') {
            *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
            goto LAB_001403f6;
          }
          if (*(char *)(lVar16 + -1 + lVar34) != '\0') {
            *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + -8 + lVar34 * 4);
            goto LAB_0013fac1;
          }
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar40 = UFPC::length_ + 1;
          *(uint *)(lVar36 + lVar34 * 4) = UFPC::length_;
          UFPC::length_ = uVar40;
          goto LAB_0013fac1;
        }
        uVar21 = (ulong)iVar27;
        if (*(char *)(lVar16 + 2 + uVar21) == '\0') {
          if (*(char *)(lVar16 + uVar21) != '\0') {
            *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar31 + uVar21 * 4);
LAB_0013f0ed:
            lVar34 = (long)(int)local_140;
            uVar19 = lVar34 + 2;
            iVar27 = (int)uVar19;
            if (local_180 <= iVar27) {
              if (local_180 < iVar27) goto LAB_001405b5;
              uVar21 = uVar19 & 0xffffffff;
              if (*(char *)(lVar33 + uVar21) == '\0') {
                if (*(char *)(lVar32 + uVar21) == '\0') goto LAB_00140b3d;
                if (*(char *)(lVar33 + 3 + lVar34) == '\0') goto LAB_00140738;
              }
              if (*(char *)(lVar16 + 3 + lVar34) == '\0') goto LAB_00140738;
              if (*(char *)(lVar29 + uVar21) != '\0') goto LAB_00141230;
              uVar40 = UFPC::Merge(*(uint *)(lVar31 + uVar21 * 4),*(uint *)(lVar36 + lVar34 * 4));
              goto LAB_001405f2;
            }
            if (*(char *)(lVar33 + uVar19) == '\0') {
              if (*(char *)(lVar32 + uVar19) == '\0') {
LAB_0014067f:
                iVar27 = (int)uVar19;
                lVar34 = (long)iVar27;
                if (*(char *)(lVar34 + 1 + lVar33) == '\0') {
LAB_0013f7a6:
                  uVar40 = UFPC::length_;
                  lVar34 = (long)iVar27;
                  if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
                    *(undefined4 *)(lVar36 + lVar34 * 4) = 0;
                    uVar21 = lVar34 + 2;
                    if (local_180 <= (int)uVar21) {
                      cVar1 = *(char *)(lVar33 + (uVar21 & 0xffffffff));
                      if (local_180 < (int)uVar21) {
                        if (cVar1 != '\0') goto LAB_0013ffd4;
                        goto LAB_0013f882;
                      }
                      if (cVar1 != '\0') goto LAB_0013ffad;
                      goto LAB_0013f8d6;
                    }
                    local_140 = uVar21;
                    if (*(char *)(lVar33 + uVar21) != '\0') goto LAB_0013f990;
LAB_0013f034:
                    lVar34 = (long)(int)local_140;
                    if (*(char *)(lVar32 + lVar34) == '\0') goto LAB_0013f071;
                    if (*(char *)(lVar33 + 1 + lVar34) == '\0') goto LAB_0013fda0;
                    local_140 = local_140 & 0xffffffff;
                  }
                  else {
                    UFPC::P_[UFPC::length_] = UFPC::length_;
                    uVar23 = UFPC::length_ + 1;
                    *(uint *)(lVar36 + lVar34 * 4) = UFPC::length_;
                    UFPC::length_ = uVar23;
                    uVar21 = lVar34 + 2;
                    iVar27 = (int)uVar21;
                    if (local_180 <= iVar27) {
                      uVar19 = uVar21 & 0xffffffff;
                      if (local_180 < iVar27) {
                        if (*(char *)(lVar33 + uVar19) != '\0') goto LAB_0013ff19;
                        local_140 = (ulong)iVar27;
                        goto LAB_00140e28;
                      }
                      if (*(char *)(lVar33 + uVar19) != '\0') {
                        uVar21 = uVar21 & 0xffffffff;
                        goto LAB_0013fecb;
                      }
                      if (*(char *)(lVar32 + uVar19) == '\0') goto LAB_0013f8f4;
                      if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
                        *(uint *)(lVar36 + uVar19 * 4) = uVar40;
                        goto LAB_00141a6c;
                      }
                      uVar19 = (ulong)iVar27;
                      goto LAB_00140032;
                    }
                    if (*(char *)(lVar33 + uVar21) == '\0') {
                      if (*(char *)(lVar32 + uVar21) == '\0') {
                        local_140 = uVar21 & 0xffffffff;
                        goto LAB_0013f071;
                      }
                      if (*(char *)(lVar33 + 3 + lVar34) != '\0') {
                        local_140 = uVar21 & 0xffffffff;
                        goto LAB_0013fbe8;
                      }
                      *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                      local_140 = uVar21 & 0xffffffff;
                      goto LAB_0013fdcb;
                    }
                    local_140 = uVar21 & 0xffffffff;
LAB_0013fe09:
                    iVar27 = (int)local_140;
                    lVar34 = (long)iVar27;
                    if (*(char *)(lVar34 + 1 + lVar16) != '\0') {
                      uVar19 = local_140;
                      if (*(char *)(lVar16 + lVar34) == '\0') {
                        if (*(char *)(lVar16 + -1 + lVar34) == '\0') {
                          uVar40 = UFPC::Merge(*(uint *)(lVar31 + lVar34 * 4),
                                               *(uint *)(lVar36 + -8 + lVar34 * 4));
                          *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                        }
                        else {
                          if (*(char *)(lVar29 + lVar34) == '\0') {
                            uVar40 = UFPC::Merge(*(uint *)(lVar31 + -8 + lVar34 * 4),
                                                 *(uint *)(lVar31 + lVar34 * 4));
                            uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
                          }
                          else {
                            uVar40 = UFPC::Merge(*(uint *)(lVar31 + lVar34 * 4),
                                                 *(uint *)(lVar36 + -8 + lVar34 * 4));
                          }
                          *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                          uVar19 = local_140 & 0xffffffff;
                        }
                      }
                      else {
                        uVar40 = UFPC::Merge(*(uint *)(lVar31 + lVar34 * 4),
                                             *(uint *)(lVar36 + -8 + lVar34 * 4));
                        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                      }
                      goto LAB_001417c6;
                    }
                    if (*(char *)(lVar33 + 1 + lVar34) != '\0') {
                      if (*(char *)(lVar34 + 2 + lVar16) == '\0') {
                        if (*(char *)(lVar16 + -1 + lVar34) == '\0') goto LAB_0013fcbe;
                        uVar40 = UFPC::Merge(*(uint *)(lVar31 + -8 + lVar34 * 4),
                                             *(uint *)(lVar36 + -8 + lVar34 * 4));
                        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                        goto LAB_001407b8;
                      }
                      if (*(char *)(lVar16 + lVar34) == '\0') {
                        if (*(char *)(lVar16 + -1 + lVar34) == '\0') {
                          uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                               *(uint *)(lVar36 + -8 + lVar34 * 4));
                        }
                        else {
                          if (*(char *)(lVar29 + 1 + lVar34) != '\0') {
                            if (*(char *)(lVar29 + lVar34) == '\0') {
                              uVar40 = *(uint *)(lVar31 + -8 + lVar34 * 4);
                              goto LAB_001402e3;
                            }
                            goto LAB_0013ff86;
                          }
                          uVar40 = UFPC::Merge(*(uint *)(lVar31 + -8 + lVar34 * 4),
                                               *(uint *)(lVar31 + 8 + lVar34 * 4));
                          uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
                        }
                        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                      }
                      else {
                        if (*(char *)(lVar29 + 1 + lVar34) == '\0') {
                          uVar40 = *(uint *)(lVar31 + lVar34 * 4);
LAB_001402e3:
                          uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar31 + 8 + lVar34 * 4));
                          uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
                        }
                        else {
LAB_0013ff86:
                          uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                               *(uint *)(lVar36 + -8 + lVar34 * 4));
                        }
                        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
                      }
                      goto LAB_0013f1f0;
                    }
                    uVar21 = (ulong)iVar27;
                    if (*(char *)(lVar16 + -1 + uVar21) == '\0') goto LAB_00140253;
                    uVar40 = UFPC::Merge(*(uint *)(lVar31 + -8 + uVar21 * 4),
                                         *(uint *)(lVar36 + -8 + uVar21 * 4));
                    *(uint *)(lVar36 + uVar21 * 4) = uVar40;
LAB_00140f27:
                    lVar34 = (long)iVar27;
                    local_140 = lVar34 + 2;
                    uVar21 = local_140;
                    if (local_180 <= (int)local_140) {
                      uVar49 = local_140 & 0xffffffff;
                      if (local_180 < (int)local_140) {
                        if (*(char *)(lVar33 + uVar49) == '\0') {
LAB_00140ff0:
                          iVar27 = (int)local_140;
                          goto LAB_00140ff5;
                        }
                        if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
LAB_00140fe3:
                          uVar21 = uVar21 & 0xffffffff;
LAB_00140fe6:
                          uVar40 = (uint)uVar21;
                          goto LAB_0013efca;
                        }
                      }
                      else {
                        if (*(char *)(lVar33 + uVar49) == '\0') {
                          if (*(char *)(lVar32 + uVar49) == '\0') {
LAB_001412d4:
                            uVar21 = local_140 & 0xffffffff;
                            goto LAB_0013f8f4;
                          }
                          if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
LAB_001412c7:
                            iVar27 = (int)uVar21;
                            goto LAB_00141002;
                          }
                        }
                        if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
LAB_001410b1:
                          uVar40 = (uint)local_140;
                          goto LAB_0013ef52;
                        }
                        if (*(char *)(lVar16 + 3 + lVar34) != '\0') {
                          if (*(char *)(lVar16 + lVar34) == '\0') {
                            uVar40 = UFPC::Merge(*(uint *)(lVar31 + uVar49 * 4),
                                                 *(uint *)(lVar36 + lVar34 * 4));
                            *(uint *)(lVar36 + uVar49 * 4) = uVar40;
                            goto LAB_00141a6c;
                          }
LAB_00141094:
                          uVar19 = (ulong)(int)local_140;
                          if (*(char *)(lVar29 + -1 + uVar19) != '\0') goto LAB_00141a1a;
                          uVar40 = *(uint *)(lVar31 + uVar19 * 4);
                          uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
                          goto LAB_001412f3;
                        }
                      }
                      if (*(char *)(lVar16 + uVar49) != '\0') goto LAB_00141222;
                      *(undefined4 *)(lVar36 + uVar49 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
                      goto LAB_00141a6c;
                    }
                    uVar19 = local_140;
                    if (*(char *)(lVar33 + local_140) != '\0') {
                      if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_0013ef86;
                      if (*(char *)(lVar34 + 3 + lVar16) != '\0') {
                        if (*(char *)(lVar16 + lVar34) == '\0') {
                          uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                               *(uint *)(lVar36 + lVar34 * 4));
                          *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                          goto LAB_001417c6;
                        }
LAB_00140f69:
                        if (*(char *)(lVar29 + -1 + uVar21) != '\0') goto LAB_00140e93;
                        uVar40 = UFPC::Merge(*(uint *)(lVar31 + uVar21 * 4),
                                             *(uint *)(lVar36 + -8 + uVar21 * 4));
                        *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                        uVar19 = uVar21;
                        goto LAB_001417c6;
                      }
                      if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
                        if (*(char *)(lVar16 + local_140) == '\0') goto LAB_0014149d;
                        if (*(char *)(lVar16 + lVar34) != '\0') goto LAB_00141479;
                        uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                             *(uint *)(lVar36 + lVar34 * 4));
                        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
LAB_001403f6:
                        while( true ) {
                          lVar34 = (long)(int)local_140;
                          uVar21 = lVar34 + 2;
                          local_140 = uVar21;
                          uVar19 = uVar21;
                          if (local_180 <= (int)uVar21) break;
                          if (*(char *)(lVar33 + uVar21) == '\0') {
                            if (*(char *)(lVar32 + uVar21) == '\0') goto LAB_001411b3;
                            if (*(char *)(lVar34 + 3 + lVar33) == '\0') goto LAB_0013fd8a;
                            if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_0013f083;
                            if (*(char *)(lVar16 + 3 + lVar34) != '\0') goto LAB_00141155;
LAB_001404d9:
                            if (*(char *)(lVar34 + 4 + lVar16) == '\0') {
                              if (*(char *)(lVar16 + uVar21) == '\0') goto LAB_001414e3;
                              goto LAB_001414bc;
                            }
                            if (*(char *)(lVar29 + 3 + lVar34) != '\0') goto LAB_00141346;
                            if (*(char *)(lVar16 + uVar21) != '\0') goto LAB_001415e4;
                            goto LAB_001414ef;
                          }
                          if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_0013ef86;
                          if (*(char *)(lVar34 + 3 + lVar16) != '\0') goto LAB_00140f69;
                          if (*(char *)(lVar33 + 3 + lVar34) != '\0') goto LAB_001404d9;
                          if (*(char *)(lVar16 + uVar21) == '\0') {
LAB_0014149d:
                            *(undefined4 *)(lVar36 + 8 + lVar34 * 4) =
                                 *(undefined4 *)(lVar36 + lVar34 * 4);
                            local_140 = uVar21;
LAB_0013fac1:
                            while( true ) {
                              lVar34 = (long)(int)local_140;
                              uVar21 = lVar34 + 2;
                              iVar27 = (int)uVar21;
                              if (local_180 <= iVar27) {
                                uVar49 = uVar21 & 0xffffffff;
                                if (iVar27 <= local_180) {
                                  if (*(char *)(lVar33 + uVar49) == '\0') goto LAB_0013ffff;
                                  uVar19 = (ulong)iVar27;
                                  goto LAB_00140020;
                                }
                                if (*(char *)(lVar33 + uVar49) == '\0') {
                                  local_140 = uVar21 & 0xffffffff;
                                  goto LAB_00140ff0;
                                }
                                if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_00140fe6;
                                uVar19 = (ulong)iVar27;
                                goto LAB_0014003d;
                              }
                              if (*(char *)(lVar33 + uVar21) == '\0') goto LAB_0013fbc8;
                              if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_0013ef86;
                              if (*(char *)(lVar34 + 3 + lVar16) != '\0') {
                                uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                                     *(uint *)(lVar36 + lVar34 * 4));
                                *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                                uVar19 = uVar21 & 0xffffffff;
                                goto LAB_001417c6;
                              }
                              local_140 = uVar21;
                              if (*(char *)(lVar33 + 3 + lVar34) != '\0') goto LAB_0013fc54;
LAB_00140253:
                              local_140 = local_140 & 0xffffffff;
                              if (*(char *)(lVar16 + uVar21) != '\0') break;
                              *(undefined4 *)(lVar36 + uVar21 * 4) =
                                   *(undefined4 *)(lVar36 + -8 + uVar21 * 4);
                            }
                            uVar40 = UFPC::Merge(*(uint *)(lVar31 + uVar21 * 4),
                                                 *(uint *)(lVar36 + -8 + uVar21 * 4));
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                          else {
LAB_00141479:
                            uVar40 = *(uint *)(lVar31 + local_140 * 4);
                            if (*(char *)(lVar29 + -1 + local_140) == '\0') {
                              uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + local_140 * 4));
                              *(uint *)(lVar36 + local_140 * 4) = uVar40;
                            }
                            else {
                              *(uint *)(lVar36 + local_140 * 4) = uVar40;
                            }
                          }
                        }
                        uVar49 = uVar21 & 0xffffffff;
                        if (local_180 < (int)uVar21) {
                          if (*(char *)(lVar33 + uVar49) == '\0') goto LAB_00140ff0;
                          if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_00140fe3;
                        }
                        else {
                          if (*(char *)(lVar33 + uVar49) == '\0') {
                            if (*(char *)(lVar32 + uVar49) == '\0') goto LAB_001412d4;
                            if (*(char *)(lVar33 + 3 + lVar34) == '\0') goto LAB_001412c7;
                          }
                          if (*(char *)(lVar32 + 1 + lVar34) == '\0') goto LAB_001410b1;
                          if (*(char *)(lVar16 + 3 + lVar34) != '\0') goto LAB_00141094;
                        }
                        if (*(char *)(lVar16 + uVar49) != '\0') goto LAB_00141230;
                        *(undefined4 *)(lVar36 + uVar49 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
                        goto LAB_00141a6c;
                      }
LAB_0014131f:
                      if (*(char *)(lVar34 + 4 + lVar16) == '\0') {
                        if (*(char *)(lVar16 + 2 + lVar34) == '\0') {
LAB_001414e3:
                          *(undefined4 *)(lVar36 + 8 + lVar34 * 4) =
                               *(undefined4 *)(lVar36 + lVar34 * 4);
                          goto LAB_00140788;
                        }
                        if (*(char *)(lVar16 + lVar34) == '\0') {
                          uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                               *(uint *)(lVar36 + lVar34 * 4));
                          *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                        }
                        else {
LAB_001414bc:
                          local_140 = uVar21 & 0xffffffff;
                          uVar40 = *(uint *)(lVar31 + uVar21 * 4);
                          if (*(char *)(lVar29 + -1 + uVar21) == '\0') {
                            uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                          else {
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                        }
                        goto LAB_0013f0ed;
                      }
                      if (*(char *)(lVar29 + 3 + lVar34) != '\0') {
                        if (*(char *)(lVar16 + lVar34) == '\0') {
LAB_001414ef:
                          uVar40 = UFPC::Merge(*(uint *)(lVar31 + 0x10 + lVar34 * 4),
                                               *(uint *)(lVar36 + lVar34 * 4));
                          *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                          goto LAB_0013f1f0;
                        }
LAB_00141346:
                        local_140 = uVar21 & 0xffffffff;
                        if (*(char *)(lVar29 + -1 + uVar21) != '\0') goto LAB_00140ee4;
                        uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + uVar21 * 4),
                                             *(uint *)(lVar36 + -8 + uVar21 * 4));
                        goto LAB_00140ef3;
                      }
                      if (*(char *)(lVar16 + local_140) == '\0') {
                        uVar40 = UFPC::Merge(*(uint *)(lVar31 + 0x10 + lVar34 * 4),
                                             *(uint *)(lVar36 + lVar34 * 4));
                        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                      }
                      else {
                        if (*(char *)(lVar16 + lVar34) != '\0') {
LAB_001415e4:
                          local_140 = uVar21 & 0xffffffff;
                          if (*(char *)(lVar29 + -1 + uVar21) == '\0') {
                            uVar40 = UFPC::Merge(*(uint *)(lVar31 + uVar21 * 4),
                                                 *(uint *)(lVar31 + 8 + uVar21 * 4));
                            uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                          else {
                            uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + uVar21 * 4),
                                                 *(uint *)(lVar36 + -8 + uVar21 * 4));
                            *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                          }
                          goto LAB_0013f1f0;
                        }
                        uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                             *(uint *)(lVar31 + 0x10 + lVar34 * 4));
                        uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + lVar34 * 4));
                        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                      }
                      local_140 = local_140 & 0xffffffff;
                      goto LAB_0013f1f0;
                    }
                    if (*(char *)(lVar32 + local_140) == '\0') {
LAB_001411b3:
                      local_140 = local_140 & 0xffffffff;
                      goto LAB_0013f071;
                    }
                    if (*(char *)(lVar34 + 3 + lVar33) == '\0') goto LAB_0013fd8a;
                    if (*(char *)(lVar32 + 1 + lVar34) != '\0') {
                      if (*(char *)(lVar16 + 3 + lVar34) == '\0') goto LAB_0014131f;
                      if (*(char *)(lVar16 + lVar34) == '\0') {
                        uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                             *(uint *)(lVar36 + lVar34 * 4));
                        *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
                        goto LAB_00140de9;
                      }
LAB_00141155:
                      uVar19 = local_140;
                      if (*(char *)(lVar29 + -1 + local_140) != '\0') goto LAB_00141b30;
                      uVar40 = UFPC::Merge(*(uint *)(lVar31 + local_140 * 4),
                                           *(uint *)(lVar36 + -8 + local_140 * 4));
                      *(uint *)(lVar36 + local_140 * 4) = uVar40;
                      goto LAB_00140de9;
                    }
                  }
                  goto LAB_0013f083;
                }
                if (*(char *)(lVar16 + 1 + lVar34) != '\0') {
                  *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
                  goto LAB_00140de9;
                }
                if (*(char *)(lVar34 + 2 + lVar16) != '\0') {
                  *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + 8 + lVar34 * 4);
                  local_140 = uVar19 & 0xffffffff;
                  goto LAB_0013f1f0;
                }
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar40 = UFPC::length_ + 1;
                *(uint *)(lVar36 + lVar34 * 4) = UFPC::length_;
                UFPC::length_ = uVar40;
LAB_00140788:
                local_140 = uVar19 & 0xffffffff;
                goto LAB_0014053f;
              }
              if (*(char *)(lVar34 + 3 + lVar33) == '\0') goto LAB_00140744;
              if (*(char *)(lVar16 + 3 + lVar34) == '\0') goto LAB_0013f4bc;
              uVar21 = uVar19;
              if (*(char *)(lVar29 + uVar19) == '\0') {
                uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                                     *(uint *)(lVar36 + lVar34 * 4));
                *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
              }
              else {
LAB_00140bc2:
                uVar40 = *(uint *)(lVar31 + uVar21 * 4);
                if (*(char *)(lVar29 + -1 + uVar21) == '\0') {
                  uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
                  *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                }
                else {
                  *(uint *)(lVar36 + uVar21 * 4) = uVar40;
                }
              }
              goto LAB_00140de9;
            }
            if (*(char *)(lVar34 + 3 + lVar16) != '\0') {
              uVar21 = uVar19;
              if (*(char *)(lVar29 + uVar19) != '\0') goto LAB_0013f128;
              uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),*(uint *)(lVar36 + lVar34 * 4)
                                  );
              *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
              goto LAB_001417c6;
            }
            if (*(char *)(lVar33 + 3 + lVar34) == '\0') {
              *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
              goto LAB_00140f27;
            }
LAB_0013f4bc:
            if (*(char *)(lVar34 + 4 + lVar16) == '\0') {
              *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
              local_140 = uVar19 & 0xffffffff;
              goto LAB_001407b8;
            }
            if (*(char *)(lVar29 + 3 + lVar34) == '\0') {
              uVar40 = *(uint *)(lVar31 + 0x10 + lVar34 * 4);
            }
            else {
              local_140 = uVar19;
              if (*(char *)(lVar29 + uVar19) != '\0') goto LAB_0014099f;
              uVar40 = *(uint *)(lVar31 + 0x10 + lVar34 * 4);
            }
            uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + lVar34 * 4));
            *(uint *)(lVar36 + 8 + lVar34 * 4) = uVar40;
            local_140 = uVar19 & 0xffffffff;
            goto LAB_0013f1f0;
          }
          if (*(char *)(lVar16 + -1 + uVar21) == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar40 = UFPC::length_ + 1;
            *(uint *)(lVar36 + uVar21 * 4) = UFPC::length_;
            UFPC::length_ = uVar40;
          }
          else {
            *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar31 + -8 + uVar21 * 4);
          }
          goto LAB_0014053f;
        }
        if (*(char *)(lVar16 + uVar21) != '\0') goto LAB_0013f0c0;
        if (*(char *)(lVar16 + -1 + uVar21) != '\0') goto LAB_00141e33;
        goto LAB_00140eef;
      }
      if ((*(char *)(lVar16 + lVar34) != '\0') || (*(char *)(lVar16 + -1 + lVar34) == '\0')) {
        *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
        uVar19 = local_140 & 0xffffffff;
        goto LAB_001417c6;
      }
      uVar19 = local_140 & 0xffffffff;
      goto LAB_00141bf0;
    }
    uVar49 = uVar21 & 0xffffffff;
    if (local_180 < iVar27) {
      if (*(char *)(lVar33 + uVar49) == '\0') {
LAB_00140ff5:
        if (*(char *)(lVar32 + uVar49) == '\0') {
          *(undefined4 *)(lVar36 + uVar49 * 4) = 0;
        }
        else {
LAB_00141002:
          lVar33 = (long)iVar27;
          if (*(char *)(lVar32 + -1 + lVar33) == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar40 = UFPC::length_ + 1;
            *(uint *)(lVar36 + lVar33 * 4) = UFPC::length_;
            UFPC::length_ = uVar40;
          }
          else {
            *(undefined4 *)(lVar36 + lVar33 * 4) = *(undefined4 *)(lVar36 + -8 + lVar33 * 4);
          }
        }
        goto LAB_00141a6c;
      }
      if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
LAB_0013ffd4:
        local_140 = (ulong)(int)uVar21;
        if (*(char *)(lVar16 + local_140) != '\0') goto LAB_0013efd8;
        if (*(char *)(lVar16 + -1 + local_140) == '\0') goto LAB_0013f91a;
        uVar10 = *(undefined4 *)(lVar31 + -8 + local_140 * 4);
        goto LAB_00141a64;
      }
LAB_0013ff19:
      uVar19 = (ulong)iVar27;
      if (*(char *)(lVar16 + -1 + uVar19) == '\0') goto LAB_0014003d;
      uVar40 = *(uint *)(lVar31 + -8 + uVar19 * 4);
    }
    else {
      if (*(char *)(lVar33 + uVar49) == '\0') {
LAB_0013ffff:
        iVar27 = (int)uVar21;
        if (*(char *)(lVar32 + uVar49) == '\0') goto LAB_0013f8f4;
        uVar19 = (ulong)iVar27;
        if (*(char *)(lVar33 + 1 + uVar19) == '\0') goto LAB_00141002;
LAB_00140020:
        uVar40 = (uint)uVar21;
        if (*(char *)(lVar32 + -1 + uVar19) == '\0') goto LAB_0013ef52;
LAB_00140032:
        if (*(char *)(lVar16 + 1 + uVar19) == '\0') {
LAB_0014003d:
          if (*(char *)(lVar16 + uVar19) == '\0') {
            *(undefined4 *)(lVar36 + uVar19 * 4) = *(undefined4 *)(lVar36 + -8 + uVar19 * 4);
            goto LAB_00141a6c;
          }
        }
      }
      else {
        if (*(char *)(lVar32 + 1 + lVar34) == '\0') {
LAB_0013ffad:
          uVar19 = (ulong)(int)uVar21;
          if (*(char *)(lVar16 + 1 + uVar19) == '\0') goto LAB_0013ffd4;
          if ((*(char *)(lVar16 + uVar19) != '\0') || (*(char *)(lVar16 + -1 + uVar19) == '\0'))
          goto LAB_00141a21;
          goto LAB_0014197b;
        }
LAB_0013fecb:
        iVar27 = (int)uVar21;
        uVar19 = (ulong)iVar27;
        if (*(char *)(lVar16 + 1 + uVar19) == '\0') goto LAB_0013ff19;
        if (*(char *)(lVar16 + uVar19) == '\0') {
          if (*(char *)(lVar16 + -1 + uVar19) == '\0') {
            uVar40 = UFPC::Merge(*(uint *)(lVar31 + uVar19 * 4),*(uint *)(lVar36 + -8 + uVar19 * 4))
            ;
            *(uint *)(lVar36 + uVar19 * 4) = uVar40;
          }
          else {
            if (*(char *)(lVar29 + uVar19) == '\0') {
              uVar40 = UFPC::Merge(*(uint *)(lVar31 + -8 + uVar19 * 4),
                                   *(uint *)(lVar31 + uVar19 * 4));
              uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
            }
            else {
              uVar40 = *(uint *)(lVar31 + uVar19 * 4);
              uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
            }
            uVar40 = UFPC::Merge(uVar40,uVar23);
            *(uint *)(lVar36 + uVar19 * 4) = uVar40;
          }
          goto LAB_00141a6c;
        }
      }
      uVar40 = *(uint *)(lVar31 + uVar19 * 4);
    }
    uVar23 = *(uint *)(lVar36 + -8 + uVar19 * 4);
    goto LAB_00140052;
  }
  uVar21 = local_140;
  uVar19 = local_140 & 0xffffffff;
LAB_00141b21:
  local_140 = uVar19 & 0xffffffff;
  if (*(char *)(lVar16 + 1 + uVar21) == '\0') goto LAB_00140eb4;
LAB_00141b30:
  lVar34 = (long)(int)uVar19;
  if (*(char *)(lVar16 + lVar34) == '\0') {
    uVar40 = *(uint *)(lVar31 + lVar34 * 4);
    if (*(char *)(lVar29 + lVar34) != '\0') {
      *(uint *)(lVar36 + lVar34 * 4) = uVar40;
      goto LAB_00140de9;
    }
    uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
  }
  else {
    uVar40 = *(uint *)(lVar31 + lVar34 * 4);
  }
  *(uint *)(lVar36 + lVar34 * 4) = uVar40;
  goto LAB_00140de9;
LAB_00140e7b:
  iVar27 = (int)local_140;
  uVar21 = (ulong)iVar27;
  if (*(char *)(uVar21 + 1 + lVar16) != '\0') {
    uVar21 = local_140 & 0xffffffff;
LAB_00140e93:
    lVar34 = (long)(int)uVar21;
    uVar19 = uVar21;
    if (*(char *)(lVar16 + lVar34) == '\0') {
      uVar40 = *(uint *)(lVar31 + lVar34 * 4);
      if (*(char *)(lVar29 + lVar34) != '\0') {
        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
        goto LAB_001417c6;
      }
      uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + lVar34 * 4));
    }
    else {
      uVar40 = *(uint *)(lVar31 + lVar34 * 4);
    }
    *(uint *)(lVar36 + lVar34 * 4) = uVar40;
    goto LAB_001417c6;
  }
  if (*(char *)(lVar33 + 1 + uVar21) == '\0') {
    *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar36 + -8 + uVar21 * 4);
    goto LAB_00140f27;
  }
LAB_00140eb4:
  if (*(char *)(lVar16 + 2 + uVar21) == '\0') {
    *(undefined4 *)(lVar36 + uVar21 * 4) = *(undefined4 *)(lVar36 + -8 + uVar21 * 4);
    goto LAB_001407b8;
  }
LAB_00140eca:
  if (*(char *)(lVar29 + 1 + uVar21) == '\0') {
    uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + uVar21 * 4),*(uint *)(lVar36 + -8 + uVar21 * 4));
    *(uint *)(lVar36 + uVar21 * 4) = uVar40;
  }
  else {
LAB_00140ee4:
    if (*(char *)(lVar16 + uVar21) == '\0') {
      uVar40 = *(uint *)(lVar31 + 8 + uVar21 * 4);
      if (*(char *)(lVar29 + uVar21) == '\0') {
        uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar36 + -8 + uVar21 * 4));
        *(uint *)(lVar36 + uVar21 * 4) = uVar40;
      }
      else {
        *(uint *)(lVar36 + uVar21 * 4) = uVar40;
      }
    }
    else {
LAB_00140eef:
      uVar40 = *(uint *)(lVar31 + 8 + uVar21 * 4);
LAB_00140ef3:
      *(uint *)(lVar36 + uVar21 * 4) = uVar40;
    }
  }
  goto LAB_0013f1f0;
LAB_00140744:
  uVar40 = (uint)uVar19;
  *(undefined4 *)(lVar36 + 8 + lVar34 * 4) = *(undefined4 *)(lVar36 + lVar34 * 4);
LAB_0014074b:
  local_140 = (ulong)uVar40;
  goto LAB_0013fdcb;
LAB_0013fbc8:
  local_140 = uVar21 & 0xffffffff;
  uVar21 = (ulong)(int)uVar21;
  if (*(char *)(lVar32 + uVar21) != '\0') {
    if (*(char *)(lVar33 + 1 + uVar21) == '\0') {
LAB_0013fd8a:
      lVar34 = (long)(int)local_140;
      if (*(char *)(lVar32 + -1 + lVar34) == '\0') {
LAB_0013fda0:
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar40 = UFPC::length_ + 1;
        *(uint *)(lVar36 + lVar34 * 4) = UFPC::length_;
        UFPC::length_ = uVar40;
      }
      else {
        *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar36 + -8 + lVar34 * 4);
      }
      goto LAB_0013fdcb;
    }
    if (*(char *)(lVar32 + -1 + uVar21) != '\0') {
LAB_0013fbe8:
      if (*(char *)(lVar16 + 1 + uVar21) != '\0') {
        uVar40 = UFPC::Merge(*(uint *)(lVar31 + uVar21 * 4),*(uint *)(lVar36 + -8 + uVar21 * 4));
        *(uint *)(lVar36 + uVar21 * 4) = uVar40;
        uVar19 = local_140;
        goto LAB_00140de9;
      }
LAB_0013fc54:
      lVar34 = (long)(int)local_140;
      if (*(char *)(lVar34 + 2 + lVar16) != '\0') {
        if (*(char *)(lVar29 + 1 + lVar34) == '\0') {
          if (*(char *)(lVar16 + lVar34) == '\0') {
            uVar23 = *(uint *)(lVar31 + 8 + lVar34 * 4);
            uVar40 = *(uint *)(lVar36 + -8 + lVar34 * 4);
          }
          else {
            uVar23 = UFPC::Merge(*(uint *)(lVar31 + lVar34 * 4),*(uint *)(lVar31 + 8 + lVar34 * 4));
            uVar40 = *(uint *)(lVar36 + -8 + lVar34 * 4);
          }
          uVar40 = UFPC::Merge(uVar23,uVar40);
          *(uint *)(lVar36 + lVar34 * 4) = uVar40;
          local_140 = local_140 & 0xffffffff;
        }
        else {
          uVar40 = UFPC::Merge(*(uint *)(lVar31 + 8 + lVar34 * 4),
                               *(uint *)(lVar36 + -8 + lVar34 * 4));
          *(uint *)(lVar36 + lVar34 * 4) = uVar40;
          local_140 = local_140 & 0xffffffff;
        }
        goto LAB_0013f1f0;
      }
      local_140 = local_140 & 0xffffffff;
LAB_0013fcbe:
      if (*(char *)(lVar16 + lVar34) != '\0') {
        uVar40 = UFPC::Merge(*(uint *)(lVar31 + lVar34 * 4),*(uint *)(lVar36 + -8 + lVar34 * 4));
        *(uint *)(lVar36 + lVar34 * 4) = uVar40;
        goto LAB_0013f0ed;
      }
      *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar36 + -8 + lVar34 * 4);
      goto LAB_0014053f;
    }
    goto LAB_0013f083;
  }
LAB_0013f071:
  iVar27 = (int)local_140;
  local_140 = local_140 & 0xffffffff;
  if (*(char *)(lVar33 + 1 + (long)iVar27) != '\0') goto LAB_0013f083;
  goto LAB_0013f7a6;
LAB_0013f083:
  lVar34 = (long)(int)local_140;
  if (*(char *)(lVar16 + 1 + lVar34) != '\0') {
    *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
    uVar19 = local_140;
    goto LAB_00140de9;
  }
LAB_0013f09e:
  lVar34 = (long)(int)local_140;
  if (*(char *)(lVar16 + 2 + lVar34) != '\0') {
    if (*(char *)(lVar16 + lVar34) != '\0') goto LAB_0013f0c0;
    *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + 8 + lVar34 * 4);
    goto LAB_0013f1f0;
  }
  if (*(char *)(lVar16 + lVar34) == '\0') {
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar40 = UFPC::length_ + 1;
    *(uint *)(lVar36 + lVar34 * 4) = UFPC::length_;
    UFPC::length_ = uVar40;
    goto LAB_0014053f;
  }
  *(undefined4 *)(lVar36 + lVar34 * 4) = *(undefined4 *)(lVar31 + lVar34 * 4);
  goto LAB_0013f0ed;
LAB_00141e33:
  if ((*(char *)(lVar29 + 1 + uVar21) == '\0') || (*(char *)(lVar29 + uVar21) == '\0')) {
    uVar40 = UFPC::Merge(*(uint *)(lVar31 + -8 + uVar21 * 4),*(uint *)(lVar31 + 8 + uVar21 * 4));
  }
  else {
    uVar40 = *(uint *)(lVar31 + 8 + uVar21 * 4);
  }
  *(uint *)(lVar36 + uVar21 * 4) = uVar40;
  goto LAB_0013f1f0;
code_r0x00142619:
  if (*(char *)(lVar15 + lVar44) == '\0') {
    *(undefined4 *)(lVar9 + lVar44 * 4) = *(undefined4 *)(lVar46 + (lVar13 >> 0x1e));
    uVar26 = (ulong)(uint)(iVar14 + iVar42);
    goto LAB_0014278b;
  }
  uVar40 = *(uint *)(lVar8 + lVar44 * 4);
  if (*(char *)(lVar17 + lVar30 + lVar44) == '\0') {
    uVar40 = UFPC::Merge(uVar40,*(uint *)(lVar9 + -8 + lVar44 * 4));
  }
  *(uint *)(lVar9 + lVar44 * 4) = uVar40;
  lVar13 = lVar13 + 0x200000000;
  lVar20 = lVar30 + lVar44;
  lVar44 = lVar44 + 2;
  if ((long)uVar25 <= lVar20 + 4) {
    uVar40 = iVar27 + (int)lVar44 + 2;
    iVar27 = iVar27 + (int)lVar44;
    goto LAB_00142dec;
  }
  goto LAB_001425f6;
code_r0x00142ab1:
  *(undefined4 *)(lVar30 + lVar13 * 4) = *(undefined4 *)(lVar44 + lVar13 * 4);
  lVar28 = lVar9 + lVar13;
  lVar13 = lVar13 + 2;
  if ((long)uVar25 <= lVar28 + 2) {
    iVar14 = iVar27 + (int)lVar13 + 2;
    iVar27 = iVar27 + (int)lVar13;
    goto LAB_00142e2a;
  }
  goto LAB_00142a8c;
LAB_0014255d:
  *(undefined4 *)(lVar46 + uVar21 * 4) = *(undefined4 *)(lVar22 + 8 + uVar21 * 4);
  goto LAB_0014258d;
LAB_0013ea4d:
  uVar10 = 0;
LAB_0013ea62:
  *(undefined4 *)(lVar46 + lVar33 * 4) = uVar10;
LAB_0013ea66:
  uVar40 = uVar38 + 2;
  uVar25 = (ulong)uVar40;
  if ((int)uVar23 <= (int)uVar40) goto LAB_0013ea75;
  goto LAB_0013e9b7;
}

Assistant:

void PerformLabeling()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		int e_rows = h & 0xfffffffe;
		bool o_rows = h % 2 == 1;
		int e_cols = w & 0xfffffffe;
		bool o_cols = w % 2 == 1;

		img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

		LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}

		// Second scan
		n_labels_ = LabelsSolver::Flatten();

		int r = 0;
		for (; r < e_rows; r += 2) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
					if (img_row_fol[c + 1] > 0)
						img_labels_row_fol[c + 1] = iLabel;
					else
						img_labels_row_fol[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
					img_labels_row_fol[c] = 0;
					img_labels_row_fol[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row_fol[c] = 0;
				}
			}
		}
		// Last row if the number of rows is odd
		if (o_rows) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
				}
			}
		}

		LabelsSolver::Dealloc();

	}